

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar35;
  undefined8 in_R10;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  float fVar100;
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float t1;
  undefined4 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vfloat4 b0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vfloat4 b0_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  vfloat4 a0_3;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  vfloat4 a0_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar178 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar205;
  float fVar207;
  float fVar209;
  undefined1 auVar196 [16];
  float fVar206;
  float fVar208;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  float fVar211;
  float fVar220;
  float fVar221;
  vfloat4 a0_1;
  undefined1 auVar212 [16];
  float fVar222;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  vfloat4 a0;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [8];
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar31;
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar230 [32];
  
  uVar30 = (ulong)(byte)prim[1];
  fVar210 = *(float *)(prim + uVar30 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar44 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar46 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar30 * 0x19 + 6));
  fVar121 = fVar210 * auVar46._0_4_;
  fVar100 = fVar210 * auVar44._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar30 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar43);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar30 * 5 + 6);
  auVar71 = vpmovsxbd_avx2(auVar51);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar30 * 6 + 6);
  auVar72 = vpmovsxbd_avx2(auVar50);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar30 * 0xb + 6);
  auVar83 = vpmovsxbd_avx2(auVar49);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar30 * 0xc + 6);
  auVar84 = vpmovsxbd_avx2(auVar52);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar30 * 0xd + 6);
  auVar73 = vpmovsxbd_avx2(auVar4);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar30 * 0x12 + 6);
  auVar75 = vpmovsxbd_avx2(auVar48);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar30 * 0x13 + 6);
  auVar78 = vpmovsxbd_avx2(auVar47);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76 = vcvtdq2ps_avx(auVar78);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar30 * 0x14 + 6);
  auVar69 = vpmovsxbd_avx2(auVar5);
  auVar77 = vcvtdq2ps_avx(auVar69);
  auVar131._4_4_ = fVar100;
  auVar131._0_4_ = fVar100;
  auVar131._8_4_ = fVar100;
  auVar131._12_4_ = fVar100;
  auVar131._16_4_ = fVar100;
  auVar131._20_4_ = fVar100;
  auVar131._24_4_ = fVar100;
  auVar131._28_4_ = fVar100;
  auVar236._8_4_ = 1;
  auVar236._0_8_ = 0x100000001;
  auVar236._12_4_ = 1;
  auVar236._16_4_ = 1;
  auVar236._20_4_ = 1;
  auVar236._24_4_ = 1;
  auVar236._28_4_ = 1;
  auVar79 = ZEXT1632(CONCAT412(fVar210 * auVar44._12_4_,
                               CONCAT48(fVar210 * auVar44._8_4_,
                                        CONCAT44(fVar210 * auVar44._4_4_,fVar100))));
  auVar70 = vpermps_avx2(auVar236,auVar79);
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar244 = ZEXT3264(auVar67);
  auVar68 = vpermps_avx512vl(auVar67,auVar79);
  fVar100 = auVar68._0_4_;
  fVar206 = auVar68._4_4_;
  auVar79._4_4_ = fVar206 * auVar72._4_4_;
  auVar79._0_4_ = fVar100 * auVar72._0_4_;
  fVar208 = auVar68._8_4_;
  auVar79._8_4_ = fVar208 * auVar72._8_4_;
  fVar105 = auVar68._12_4_;
  auVar79._12_4_ = fVar105 * auVar72._12_4_;
  fVar106 = auVar68._16_4_;
  auVar79._16_4_ = fVar106 * auVar72._16_4_;
  fVar107 = auVar68._20_4_;
  auVar79._20_4_ = fVar107 * auVar72._20_4_;
  fVar108 = auVar68._24_4_;
  auVar79._24_4_ = fVar108 * auVar72._24_4_;
  auVar79._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar73._4_4_ * fVar206;
  auVar78._0_4_ = auVar73._0_4_ * fVar100;
  auVar78._8_4_ = auVar73._8_4_ * fVar208;
  auVar78._12_4_ = auVar73._12_4_ * fVar105;
  auVar78._16_4_ = auVar73._16_4_ * fVar106;
  auVar78._20_4_ = auVar73._20_4_ * fVar107;
  auVar78._24_4_ = auVar73._24_4_ * fVar108;
  auVar78._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar77._4_4_ * fVar206;
  auVar69._0_4_ = auVar77._0_4_ * fVar100;
  auVar69._8_4_ = auVar77._8_4_ * fVar208;
  auVar69._12_4_ = auVar77._12_4_ * fVar105;
  auVar69._16_4_ = auVar77._16_4_ * fVar106;
  auVar69._20_4_ = auVar77._20_4_ * fVar107;
  auVar69._24_4_ = auVar77._24_4_ * fVar108;
  auVar69._28_4_ = auVar68._28_4_;
  auVar43 = vfmadd231ps_fma(auVar79,auVar70,auVar71);
  auVar51 = vfmadd231ps_fma(auVar78,auVar70,auVar84);
  auVar50 = vfmadd231ps_fma(auVar69,auVar76,auVar70);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar131,auVar74);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar131,auVar83);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar75,auVar131);
  auVar144._4_4_ = fVar121;
  auVar144._0_4_ = fVar121;
  auVar144._8_4_ = fVar121;
  auVar144._12_4_ = fVar121;
  auVar144._16_4_ = fVar121;
  auVar144._20_4_ = fVar121;
  auVar144._24_4_ = fVar121;
  auVar144._28_4_ = fVar121;
  auVar69 = ZEXT1632(CONCAT412(fVar210 * auVar46._12_4_,
                               CONCAT48(fVar210 * auVar46._8_4_,
                                        CONCAT44(fVar210 * auVar46._4_4_,fVar121))));
  auVar78 = vpermps_avx2(auVar236,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  auVar70 = vmulps_avx512vl(auVar69,auVar72);
  auVar81._0_4_ = auVar69._0_4_ * auVar73._0_4_;
  auVar81._4_4_ = auVar69._4_4_ * auVar73._4_4_;
  auVar81._8_4_ = auVar69._8_4_ * auVar73._8_4_;
  auVar81._12_4_ = auVar69._12_4_ * auVar73._12_4_;
  auVar81._16_4_ = auVar69._16_4_ * auVar73._16_4_;
  auVar81._20_4_ = auVar69._20_4_ * auVar73._20_4_;
  auVar81._24_4_ = auVar69._24_4_ * auVar73._24_4_;
  auVar81._28_4_ = 0;
  auVar73._4_4_ = auVar69._4_4_ * auVar77._4_4_;
  auVar73._0_4_ = auVar69._0_4_ * auVar77._0_4_;
  auVar73._8_4_ = auVar69._8_4_ * auVar77._8_4_;
  auVar73._12_4_ = auVar69._12_4_ * auVar77._12_4_;
  auVar73._16_4_ = auVar69._16_4_ * auVar77._16_4_;
  auVar73._20_4_ = auVar69._20_4_ * auVar77._20_4_;
  auVar73._24_4_ = auVar69._24_4_ * auVar77._24_4_;
  auVar73._28_4_ = auVar72._28_4_;
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar78,auVar71);
  auVar49 = vfmadd231ps_fma(auVar81,auVar78,auVar84);
  auVar52 = vfmadd231ps_fma(auVar73,auVar78,auVar76);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar144,auVar74);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar144,auVar83);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar144,auVar75);
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  auVar74 = vandps_avx(ZEXT1632(auVar43),auVar85);
  auVar87._8_4_ = 0x219392ef;
  auVar87._0_8_ = 0x219392ef219392ef;
  auVar87._12_4_ = 0x219392ef;
  auVar87._16_4_ = 0x219392ef;
  auVar87._20_4_ = 0x219392ef;
  auVar87._24_4_ = 0x219392ef;
  auVar87._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar74,auVar87,1);
  bVar38 = (bool)((byte)uVar36 & 1);
  auVar70._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._0_4_;
  bVar38 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._4_4_;
  bVar38 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._8_4_;
  bVar38 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar43._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar51),auVar85);
  uVar36 = vcmpps_avx512vl(auVar74,auVar87,1);
  bVar38 = (bool)((byte)uVar36 & 1);
  auVar67._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._0_4_;
  bVar38 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._4_4_;
  bVar38 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._8_4_;
  bVar38 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar51._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar50),auVar85);
  uVar36 = vcmpps_avx512vl(auVar74,auVar87,1);
  bVar38 = (bool)((byte)uVar36 & 1);
  auVar74._0_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._0_4_;
  bVar38 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._4_4_;
  bVar38 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._8_4_;
  bVar38 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar38 * 0x219392ef | (uint)!bVar38 * auVar50._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar72 = vrcp14ps_avx512vl(auVar70);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar70,auVar72,auVar86);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar67);
  auVar51 = vfnmadd213ps_fma(auVar67,auVar72,auVar86);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar74);
  auVar50 = vfnmadd213ps_fma(auVar74,auVar72,auVar86);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 7 + 6));
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar72,auVar72);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar72 = vsubps_avx512vl(auVar74,auVar71);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 9 + 6));
  auVar75._4_4_ = auVar43._4_4_ * auVar72._4_4_;
  auVar75._0_4_ = auVar43._0_4_ * auVar72._0_4_;
  auVar75._8_4_ = auVar43._8_4_ * auVar72._8_4_;
  auVar75._12_4_ = auVar43._12_4_ * auVar72._12_4_;
  auVar75._16_4_ = auVar72._16_4_ * 0.0;
  auVar75._20_4_ = auVar72._20_4_ * 0.0;
  auVar75._24_4_ = auVar72._24_4_ * 0.0;
  auVar75._28_4_ = auVar72._28_4_;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar71 = vsubps_avx512vl(auVar74,auVar71);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0xe + 6));
  auVar82._0_4_ = auVar43._0_4_ * auVar71._0_4_;
  auVar82._4_4_ = auVar43._4_4_ * auVar71._4_4_;
  auVar82._8_4_ = auVar43._8_4_ * auVar71._8_4_;
  auVar82._12_4_ = auVar43._12_4_ * auVar71._12_4_;
  auVar82._16_4_ = auVar71._16_4_ * 0.0;
  auVar82._20_4_ = auVar71._20_4_ * 0.0;
  auVar82._24_4_ = auVar71._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar49));
  auVar76._4_4_ = auVar51._4_4_ * auVar74._4_4_;
  auVar76._0_4_ = auVar51._0_4_ * auVar74._0_4_;
  auVar76._8_4_ = auVar51._8_4_ * auVar74._8_4_;
  auVar76._12_4_ = auVar51._12_4_ * auVar74._12_4_;
  auVar76._16_4_ = auVar74._16_4_ * 0.0;
  auVar76._20_4_ = auVar74._20_4_ * 0.0;
  auVar76._24_4_ = auVar74._24_4_ * 0.0;
  auVar76._28_4_ = auVar74._28_4_;
  auVar73 = vpbroadcastd_avx512vl();
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar49));
  auVar80._0_4_ = auVar51._0_4_ * auVar74._0_4_;
  auVar80._4_4_ = auVar51._4_4_ * auVar74._4_4_;
  auVar80._8_4_ = auVar51._8_4_ * auVar74._8_4_;
  auVar80._12_4_ = auVar51._12_4_ * auVar74._12_4_;
  auVar80._16_4_ = auVar74._16_4_ * 0.0;
  auVar80._20_4_ = auVar74._20_4_ * 0.0;
  auVar80._24_4_ = auVar74._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x15 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar52));
  auVar77._4_4_ = auVar74._4_4_ * auVar50._4_4_;
  auVar77._0_4_ = auVar74._0_4_ * auVar50._0_4_;
  auVar77._8_4_ = auVar74._8_4_ * auVar50._8_4_;
  auVar77._12_4_ = auVar74._12_4_ * auVar50._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * 0.0;
  auVar77._20_4_ = auVar74._20_4_ * 0.0;
  auVar77._24_4_ = auVar74._24_4_ * 0.0;
  auVar77._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x17 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar52));
  auVar68._0_4_ = auVar50._0_4_ * auVar74._0_4_;
  auVar68._4_4_ = auVar50._4_4_ * auVar74._4_4_;
  auVar68._8_4_ = auVar50._8_4_ * auVar74._8_4_;
  auVar68._12_4_ = auVar50._12_4_ * auVar74._12_4_;
  auVar68._16_4_ = auVar74._16_4_ * 0.0;
  auVar68._20_4_ = auVar74._20_4_ * 0.0;
  auVar68._24_4_ = auVar74._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar75,auVar82);
  auVar71 = vpminsd_avx2(auVar76,auVar80);
  auVar74 = vmaxps_avx(auVar74,auVar71);
  auVar71 = vpminsd_avx2(auVar77,auVar68);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar72._4_4_ = uVar109;
  auVar72._0_4_ = uVar109;
  auVar72._8_4_ = uVar109;
  auVar72._12_4_ = uVar109;
  auVar72._16_4_ = uVar109;
  auVar72._20_4_ = uVar109;
  auVar72._24_4_ = uVar109;
  auVar72._28_4_ = uVar109;
  auVar71 = vmaxps_avx512vl(auVar71,auVar72);
  auVar74 = vmaxps_avx(auVar74,auVar71);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  auVar71._16_4_ = 0x3f7ffffa;
  auVar71._20_4_ = 0x3f7ffffa;
  auVar71._24_4_ = 0x3f7ffffa;
  auVar71._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar74,auVar71);
  auVar74 = vpmaxsd_avx2(auVar75,auVar82);
  auVar71 = vpmaxsd_avx2(auVar76,auVar80);
  auVar74 = vminps_avx(auVar74,auVar71);
  auVar71 = vpmaxsd_avx2(auVar77,auVar68);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar83._4_4_ = uVar109;
  auVar83._0_4_ = uVar109;
  auVar83._8_4_ = uVar109;
  auVar83._12_4_ = uVar109;
  auVar83._16_4_ = uVar109;
  auVar83._20_4_ = uVar109;
  auVar83._24_4_ = uVar109;
  auVar83._28_4_ = uVar109;
  auVar71 = vminps_avx512vl(auVar71,auVar83);
  auVar74 = vminps_avx(auVar74,auVar71);
  auVar84._8_4_ = 0x3f800003;
  auVar84._0_8_ = 0x3f8000033f800003;
  auVar84._12_4_ = 0x3f800003;
  auVar84._16_4_ = 0x3f800003;
  auVar84._20_4_ = 0x3f800003;
  auVar84._24_4_ = 0x3f800003;
  auVar84._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar84);
  uVar16 = vcmpps_avx512vl(local_1c0,auVar74,2);
  uVar17 = vpcmpgtd_avx512vl(auVar73,_DAT_01fb4ba0);
  uVar36 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar17));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar43);
  auVar246 = ZEXT464(0x3f800000);
  auVar43 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar245 = ZEXT1664(auVar43);
LAB_019c7e92:
  if (uVar36 == 0) {
LAB_019c9a26:
    return uVar36 != 0;
  }
  lVar32 = 0;
  for (uVar30 = uVar36; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  uVar30 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar32 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar43 = *(undefined1 (*) [16])(_Var11 + uVar30 * (long)pvVar10);
  auVar51 = *(undefined1 (*) [16])(_Var11 + (uVar30 + 1) * (long)pvVar10);
  auVar50 = *(undefined1 (*) [16])(_Var11 + (uVar30 + 2) * (long)pvVar10);
  auVar49 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar30 + 3));
  lVar32 = *(long *)&pGVar8[1].time_range.upper;
  auVar52 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * uVar30);
  auVar4 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * (uVar30 + 1));
  auVar48 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * (uVar30 + 2));
  uVar37 = uVar36 - 1 & uVar36;
  auVar47 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * (uVar30 + 3));
  if (uVar37 != 0) {
    uVar35 = uVar37 - 1 & uVar37;
    for (uVar30 = uVar37; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    }
    if (uVar35 != 0) {
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar110 = ZEXT816(0) << 0x40;
  auVar46._0_4_ = auVar47._0_4_ * 0.0;
  auVar46._4_4_ = auVar47._4_4_ * 0.0;
  auVar46._8_4_ = auVar47._8_4_ * 0.0;
  auVar46._12_4_ = auVar47._12_4_ * 0.0;
  auVar46 = vfmadd231ps_fma(auVar46,auVar48,auVar110);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar46);
  auVar113._0_4_ = auVar52._0_4_ + auVar44._0_4_;
  auVar113._4_4_ = auVar52._4_4_ + auVar44._4_4_;
  auVar113._8_4_ = auVar52._8_4_ + auVar44._8_4_;
  auVar113._12_4_ = auVar52._12_4_ + auVar44._12_4_;
  auVar111 = auVar237._0_16_;
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar4,auVar111);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar52,auVar111);
  auVar212._0_4_ = auVar49._0_4_ * 0.0;
  auVar212._4_4_ = auVar49._4_4_ * 0.0;
  auVar212._8_4_ = auVar49._8_4_ * 0.0;
  auVar212._12_4_ = auVar49._12_4_ * 0.0;
  auVar46 = vfmadd231ps_fma(auVar212,auVar50,auVar110);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar51,auVar46);
  auVar223._0_4_ = auVar43._0_4_ + auVar44._0_4_;
  auVar223._4_4_ = auVar43._4_4_ + auVar44._4_4_;
  auVar223._8_4_ = auVar43._8_4_ + auVar44._8_4_;
  auVar223._12_4_ = auVar43._12_4_ + auVar44._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar111);
  auVar46 = vfnmadd231ps_avx512vl(auVar44,auVar43,auVar111);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar47);
  auVar44 = vfmadd231ps_fma(auVar44,auVar4,auVar110);
  auVar44 = vfmadd231ps_fma(auVar44,auVar52,auVar110);
  auVar47 = vmulps_avx512vl(auVar47,auVar111);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar111,auVar48);
  auVar4 = vfmadd231ps_fma(auVar48,auVar110,auVar4);
  auVar48 = vfnmadd231ps_fma(auVar4,auVar110,auVar52);
  auVar52 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar49);
  auVar52 = vfmadd231ps_fma(auVar52,auVar51,auVar110);
  auVar52 = vfmadd231ps_fma(auVar52,auVar43,auVar110);
  auVar49 = vmulps_avx512vl(auVar49,auVar111);
  auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar111,auVar50);
  auVar51 = vfmadd231ps_fma(auVar50,auVar110,auVar51);
  auVar4 = vfnmadd231ps_fma(auVar51,auVar110,auVar43);
  auVar43 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar51 = vshufps_avx(auVar223,auVar223,0xc9);
  fVar105 = auVar45._0_4_;
  auVar55._0_4_ = fVar105 * auVar51._0_4_;
  fVar106 = auVar45._4_4_;
  auVar55._4_4_ = fVar106 * auVar51._4_4_;
  fVar107 = auVar45._8_4_;
  auVar55._8_4_ = fVar107 * auVar51._8_4_;
  fVar108 = auVar45._12_4_;
  auVar55._12_4_ = fVar108 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar55,auVar43,auVar223);
  auVar50 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar56._0_4_ = fVar105 * auVar51._0_4_;
  auVar56._4_4_ = fVar106 * auVar51._4_4_;
  auVar56._8_4_ = fVar107 * auVar51._8_4_;
  auVar56._12_4_ = fVar108 * auVar51._12_4_;
  auVar43 = vfmsub231ps_fma(auVar56,auVar43,auVar46);
  auVar49 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar121 = auVar48._0_4_;
  auVar60._0_4_ = fVar121 * auVar51._0_4_;
  fVar134 = auVar48._4_4_;
  auVar60._4_4_ = fVar134 * auVar51._4_4_;
  fVar135 = auVar48._8_4_;
  auVar60._8_4_ = fVar135 * auVar51._8_4_;
  fVar136 = auVar48._12_4_;
  auVar60._12_4_ = fVar136 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar60,auVar43,auVar52);
  auVar52 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar175._0_4_ = auVar51._0_4_ * fVar121;
  auVar175._4_4_ = auVar51._4_4_ * fVar134;
  auVar175._8_4_ = auVar51._8_4_ * fVar135;
  auVar175._12_4_ = auVar51._12_4_ * fVar136;
  auVar43 = vfmsub231ps_fma(auVar175,auVar43,auVar4);
  auVar4 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar50,auVar50,0x7f);
  fVar210 = auVar43._0_4_;
  auVar176._4_12_ = ZEXT812(0) << 0x20;
  auVar176._0_4_ = fVar210;
  auVar51 = vrsqrt14ss_avx512f(auVar110,auVar176);
  auVar47 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar100 = auVar51._0_4_;
  fVar206 = auVar47._0_4_ - auVar46._0_4_ * fVar100 * fVar100 * fVar100;
  fVar211 = fVar206 * auVar50._0_4_;
  fVar220 = fVar206 * auVar50._4_4_;
  fVar221 = fVar206 * auVar50._8_4_;
  fVar222 = fVar206 * auVar50._12_4_;
  auVar51 = vdpps_avx(auVar50,auVar49,0x7f);
  auVar188._0_4_ = auVar49._0_4_ * fVar210;
  auVar188._4_4_ = auVar49._4_4_ * fVar210;
  auVar188._8_4_ = auVar49._8_4_ * fVar210;
  auVar188._12_4_ = auVar49._12_4_ * fVar210;
  fVar210 = auVar51._0_4_;
  auVar154._0_4_ = fVar210 * auVar50._0_4_;
  auVar154._4_4_ = fVar210 * auVar50._4_4_;
  auVar154._8_4_ = fVar210 * auVar50._8_4_;
  auVar154._12_4_ = fVar210 * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar188,auVar154);
  auVar51 = vrcp14ss_avx512f(auVar110,auVar176);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar210 = auVar51._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar100 = auVar43._0_4_;
  auVar168._4_12_ = ZEXT812(0) << 0x20;
  auVar168._0_4_ = fVar100;
  auVar51 = vrsqrt14ss_avx512f(auVar110,auVar168);
  auVar49 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
  fVar208 = auVar51._0_4_;
  fVar208 = auVar49._0_4_ - auVar47._0_4_ * fVar208 * fVar208 * fVar208;
  fVar195 = fVar208 * auVar52._0_4_;
  fVar205 = fVar208 * auVar52._4_4_;
  fVar207 = fVar208 * auVar52._8_4_;
  fVar209 = fVar208 * auVar52._12_4_;
  auVar51 = vdpps_avx(auVar52,auVar4,0x7f);
  auVar62._0_4_ = fVar100 * auVar4._0_4_;
  auVar62._4_4_ = fVar100 * auVar4._4_4_;
  auVar62._8_4_ = fVar100 * auVar4._8_4_;
  auVar62._12_4_ = fVar100 * auVar4._12_4_;
  fVar100 = auVar51._0_4_;
  auVar137._0_4_ = fVar100 * auVar52._0_4_;
  auVar137._4_4_ = fVar100 * auVar52._4_4_;
  auVar137._8_4_ = fVar100 * auVar52._8_4_;
  auVar137._12_4_ = fVar100 * auVar52._12_4_;
  auVar49 = vsubps_avx(auVar62,auVar137);
  auVar51 = vrcp14ss_avx512f(auVar110,auVar168);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar51,ZEXT416(0x40000000));
  fVar100 = auVar43._0_4_ * auVar51._0_4_;
  auVar43 = vshufps_avx(auVar113,auVar113,0xff);
  auVar169._0_4_ = fVar211 * auVar43._0_4_;
  auVar169._4_4_ = fVar220 * auVar43._4_4_;
  auVar169._8_4_ = fVar221 * auVar43._8_4_;
  auVar169._12_4_ = fVar222 * auVar43._12_4_;
  local_350 = vsubps_avx(auVar113,auVar169);
  auVar51 = vshufps_avx(auVar45,auVar45,0xff);
  auVar64._0_4_ = auVar51._0_4_ * fVar211 + auVar43._0_4_ * fVar206 * fVar210 * auVar50._0_4_;
  auVar64._4_4_ = auVar51._4_4_ * fVar220 + auVar43._4_4_ * fVar206 * fVar210 * auVar50._4_4_;
  auVar64._8_4_ = auVar51._8_4_ * fVar221 + auVar43._8_4_ * fVar206 * fVar210 * auVar50._8_4_;
  auVar64._12_4_ = auVar51._12_4_ * fVar222 + auVar43._12_4_ * fVar206 * fVar210 * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar45,auVar64);
  local_360._0_4_ = auVar169._0_4_ + auVar113._0_4_;
  local_360._4_4_ = auVar169._4_4_ + auVar113._4_4_;
  fStack_358 = auVar169._8_4_ + auVar113._8_4_;
  fStack_354 = auVar169._12_4_ + auVar113._12_4_;
  auVar43 = vshufps_avx(auVar44,auVar44,0xff);
  auVar65._0_4_ = fVar195 * auVar43._0_4_;
  auVar65._4_4_ = fVar205 * auVar43._4_4_;
  auVar65._8_4_ = fVar207 * auVar43._8_4_;
  auVar65._12_4_ = fVar209 * auVar43._12_4_;
  local_370 = vsubps_avx(auVar44,auVar65);
  auVar51 = vshufps_avx(auVar48,auVar48,0xff);
  auVar54._0_4_ = auVar51._0_4_ * fVar195 + auVar43._0_4_ * fVar208 * auVar49._0_4_ * fVar100;
  auVar54._4_4_ = auVar51._4_4_ * fVar205 + auVar43._4_4_ * fVar208 * auVar49._4_4_ * fVar100;
  auVar54._8_4_ = auVar51._8_4_ * fVar207 + auVar43._8_4_ * fVar208 * auVar49._8_4_ * fVar100;
  auVar54._12_4_ = auVar51._12_4_ * fVar209 + auVar43._12_4_ * fVar208 * auVar49._12_4_ * fVar100;
  auVar43 = vsubps_avx(auVar48,auVar54);
  _local_380 = vaddps_avx512vl(auVar44,auVar65);
  auVar57._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar57._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar57._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar57._12_4_ = auVar50._12_4_ * 0.33333334;
  local_390 = vaddps_avx512vl(local_350,auVar57);
  auVar58._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar58._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar58._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar58._12_4_ = auVar43._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx512vl(local_370,auVar58);
  auVar45._0_4_ = (fVar105 + auVar64._0_4_) * 0.33333334;
  auVar45._4_4_ = (fVar106 + auVar64._4_4_) * 0.33333334;
  auVar45._8_4_ = (fVar107 + auVar64._8_4_) * 0.33333334;
  auVar45._12_4_ = (fVar108 + auVar64._12_4_) * 0.33333334;
  _local_3b0 = vaddps_avx512vl(_local_360,auVar45);
  auVar110._0_4_ = (fVar121 + auVar54._0_4_) * 0.33333334;
  auVar110._4_4_ = (fVar134 + auVar54._4_4_) * 0.33333334;
  auVar110._8_4_ = (fVar135 + auVar54._8_4_) * 0.33333334;
  auVar110._12_4_ = (fVar136 + auVar54._12_4_) * 0.33333334;
  _local_3c0 = vsubps_avx512vl(_local_380,auVar110);
  local_2d0 = vsubps_avx(local_350,auVar5);
  uVar109 = local_2d0._0_4_;
  auVar63._4_4_ = uVar109;
  auVar63._0_4_ = uVar109;
  auVar63._8_4_ = uVar109;
  auVar63._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar51 = vshufps_avx(local_2d0,local_2d0,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar210 = pre->ray_space[k].vz.field_0.m128[0];
  fVar100 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar208 = pre->ray_space[k].vz.field_0.m128[3];
  auVar111._0_4_ = fVar210 * auVar51._0_4_;
  auVar111._4_4_ = fVar100 * auVar51._4_4_;
  auVar111._8_4_ = fVar206 * auVar51._8_4_;
  auVar111._12_4_ = fVar208 * auVar51._12_4_;
  auVar43 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar3,auVar43);
  auVar47 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar63);
  local_2e0 = vsubps_avx512vl(local_390,auVar5);
  uVar109 = local_2e0._0_4_;
  auVar61._4_4_ = uVar109;
  auVar61._0_4_ = uVar109;
  auVar61._8_4_ = uVar109;
  auVar61._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar51 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar66._0_4_ = fVar210 * auVar51._0_4_;
  auVar66._4_4_ = fVar100 * auVar51._4_4_;
  auVar66._8_4_ = fVar206 * auVar51._8_4_;
  auVar66._12_4_ = fVar208 * auVar51._12_4_;
  auVar43 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar43);
  auVar44 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar61);
  local_2f0 = vsubps_avx512vl(local_3a0,auVar5);
  uVar109 = local_2f0._0_4_;
  auVar155._4_4_ = uVar109;
  auVar155._0_4_ = uVar109;
  auVar155._8_4_ = uVar109;
  auVar155._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar51 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar59._0_4_ = fVar210 * auVar51._0_4_;
  auVar59._4_4_ = fVar100 * auVar51._4_4_;
  auVar59._8_4_ = fVar206 * auVar51._8_4_;
  auVar59._12_4_ = fVar208 * auVar51._12_4_;
  auVar43 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar3,auVar43);
  auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar155);
  local_300 = vsubps_avx(local_370,auVar5);
  uVar109 = local_300._0_4_;
  auVar156._4_4_ = uVar109;
  auVar156._0_4_ = uVar109;
  auVar156._8_4_ = uVar109;
  auVar156._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_300,local_300,0x55);
  auVar51 = vshufps_avx(local_300,local_300,0xaa);
  auVar177._0_4_ = auVar51._0_4_ * fVar210;
  auVar177._4_4_ = auVar51._4_4_ * fVar100;
  auVar177._8_4_ = auVar51._8_4_ * fVar206;
  auVar177._12_4_ = auVar51._12_4_ * fVar208;
  auVar43 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar3,auVar43);
  auVar45 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar156);
  local_310 = vsubps_avx(_local_360,auVar5);
  uVar109 = local_310._0_4_;
  auVar157._4_4_ = uVar109;
  auVar157._0_4_ = uVar109;
  auVar157._8_4_ = uVar109;
  auVar157._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_310,local_310,0x55);
  auVar51 = vshufps_avx(local_310,local_310,0xaa);
  auVar189._0_4_ = auVar51._0_4_ * fVar210;
  auVar189._4_4_ = auVar51._4_4_ * fVar100;
  auVar189._8_4_ = auVar51._8_4_ * fVar206;
  auVar189._12_4_ = auVar51._12_4_ * fVar208;
  auVar43 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar3,auVar43);
  auVar110 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar157);
  local_320 = vsubps_avx512vl(_local_3b0,auVar5);
  uVar109 = local_320._0_4_;
  auVar158._4_4_ = uVar109;
  auVar158._0_4_ = uVar109;
  auVar158._8_4_ = uVar109;
  auVar158._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_320,local_320,0x55);
  auVar51 = vshufps_avx(local_320,local_320,0xaa);
  auVar196._0_4_ = auVar51._0_4_ * fVar210;
  auVar196._4_4_ = auVar51._4_4_ * fVar100;
  auVar196._8_4_ = auVar51._8_4_ * fVar206;
  auVar196._12_4_ = auVar51._12_4_ * fVar208;
  auVar43 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar3,auVar43);
  auVar111 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar158);
  local_330 = vsubps_avx512vl(_local_3c0,auVar5);
  uVar109 = local_330._0_4_;
  auVar159._4_4_ = uVar109;
  auVar159._0_4_ = uVar109;
  auVar159._8_4_ = uVar109;
  auVar159._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_330,local_330,0x55);
  auVar51 = vshufps_avx(local_330,local_330,0xaa);
  auVar213._0_4_ = auVar51._0_4_ * fVar210;
  auVar213._4_4_ = auVar51._4_4_ * fVar100;
  auVar213._8_4_ = auVar51._8_4_ * fVar206;
  auVar213._12_4_ = auVar51._12_4_ * fVar208;
  auVar43 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar3,auVar43);
  auVar113 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar159);
  local_340 = vsubps_avx512vl(_local_380,auVar5);
  uVar109 = local_340._0_4_;
  auVar53._4_4_ = uVar109;
  auVar53._0_4_ = uVar109;
  auVar53._8_4_ = uVar109;
  auVar53._12_4_ = uVar109;
  auVar43 = vshufps_avx(local_340,local_340,0x55);
  auVar51 = vshufps_avx(local_340,local_340,0xaa);
  auVar147._0_4_ = auVar51._0_4_ * fVar210;
  auVar147._4_4_ = auVar51._4_4_ * fVar100;
  auVar147._8_4_ = auVar51._8_4_ * fVar206;
  auVar147._12_4_ = auVar51._12_4_ * fVar208;
  auVar43 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar3,auVar43);
  auVar5 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar53);
  auVar50 = vmovlhps_avx(auVar47,auVar110);
  auVar4 = vmovlhps_avx512f(auVar44,auVar111);
  auVar48 = vmovlhps_avx512f(auVar46,auVar113);
  _local_2b0 = vmovlhps_avx512f(auVar45,auVar5);
  auVar43 = vminps_avx512vl(auVar50,auVar4);
  auVar49 = vmaxps_avx512vl(auVar50,auVar4);
  auVar51 = vminps_avx512vl(auVar48,_local_2b0);
  auVar51 = vminps_avx(auVar43,auVar51);
  auVar43 = vmaxps_avx512vl(auVar48,_local_2b0);
  auVar43 = vmaxps_avx(auVar49,auVar43);
  auVar49 = vshufpd_avx(auVar51,auVar51,3);
  auVar52 = vshufpd_avx(auVar43,auVar43,3);
  auVar51 = vminps_avx(auVar51,auVar49);
  auVar43 = vmaxps_avx(auVar43,auVar52);
  auVar51 = vandps_avx512vl(auVar51,auVar238._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar238._0_16_);
  auVar43 = vmaxps_avx(auVar51,auVar43);
  auVar51 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar51,auVar43);
  auVar160._8_8_ = auVar47._0_8_;
  auVar160._0_8_ = auVar47._0_8_;
  auVar51 = vmovddup_avx512vl(auVar44);
  auVar49 = vmovddup_avx512vl(auVar46);
  auVar178._0_8_ = auVar45._0_8_;
  auVar178._8_8_ = auVar178._0_8_;
  local_2c0 = ZEXT416((uint)(auVar43._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2c0);
  auVar43 = vxorps_avx512vl(local_260._0_16_,auVar239._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar43);
  local_1e0 = vpbroadcastd_avx512vl();
  bVar38 = false;
  uVar30 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar52 = vsubps_avx512vl(auVar4,auVar50);
  local_290 = vsubps_avx512vl(auVar48,auVar4);
  local_2a0 = vsubps_avx512vl(_local_2b0,auVar48);
  local_3d0 = vsubps_avx(_local_360,local_350);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  local_3f0 = vsubps_avx512vl(_local_3c0,local_3a0);
  _local_400 = vsubps_avx512vl(_local_380,local_370);
  local_200 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar44 = auVar43;
LAB_019c85e2:
  auVar47 = vshufps_avx(auVar44,auVar44,0x50);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = 0x3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar230._16_4_ = 0x3f800000;
  auVar230._0_16_ = auVar227;
  auVar230._20_4_ = 0x3f800000;
  auVar230._24_4_ = 0x3f800000;
  auVar230._28_4_ = 0x3f800000;
  auVar46 = vsubps_avx(auVar227,auVar47);
  fVar210 = auVar47._0_4_;
  fVar105 = auVar110._0_4_;
  auVar128._0_4_ = fVar105 * fVar210;
  fVar100 = auVar47._4_4_;
  fVar106 = auVar110._4_4_;
  auVar128._4_4_ = fVar106 * fVar100;
  fVar206 = auVar47._8_4_;
  auVar128._8_4_ = fVar105 * fVar206;
  fVar208 = auVar47._12_4_;
  auVar128._12_4_ = fVar106 * fVar208;
  fVar107 = auVar111._0_4_;
  auVar138._0_4_ = fVar107 * fVar210;
  fVar108 = auVar111._4_4_;
  auVar138._4_4_ = fVar108 * fVar100;
  auVar138._8_4_ = fVar107 * fVar206;
  auVar138._12_4_ = fVar108 * fVar208;
  fVar121 = auVar113._0_4_;
  auVar148._0_4_ = fVar121 * fVar210;
  fVar134 = auVar113._4_4_;
  auVar148._4_4_ = fVar134 * fVar100;
  auVar148._8_4_ = fVar121 * fVar206;
  auVar148._12_4_ = fVar134 * fVar208;
  fVar135 = auVar5._0_4_;
  auVar114._0_4_ = fVar135 * fVar210;
  fVar136 = auVar5._4_4_;
  auVar114._4_4_ = fVar136 * fVar100;
  auVar114._8_4_ = fVar135 * fVar206;
  auVar114._12_4_ = fVar136 * fVar208;
  auVar45 = vfmadd231ps_fma(auVar128,auVar46,auVar160);
  auVar53 = vfmadd231ps_avx512vl(auVar138,auVar46,auVar51);
  auVar54 = vfmadd231ps_avx512vl(auVar148,auVar46,auVar49);
  auVar46 = vfmadd231ps_fma(auVar114,auVar178,auVar46);
  auVar47 = vmovshdup_avx(auVar43);
  fVar100 = auVar43._0_4_;
  fVar210 = (auVar47._0_4_ - fVar100) * 0.04761905;
  auVar174._4_4_ = fVar100;
  auVar174._0_4_ = fVar100;
  auVar174._8_4_ = fVar100;
  auVar174._12_4_ = fVar100;
  auVar174._16_4_ = fVar100;
  auVar174._20_4_ = fVar100;
  auVar174._24_4_ = fVar100;
  auVar174._28_4_ = fVar100;
  auVar126._0_8_ = auVar47._0_8_;
  auVar126._8_8_ = auVar126._0_8_;
  auVar126._16_8_ = auVar126._0_8_;
  auVar126._24_8_ = auVar126._0_8_;
  auVar74 = vsubps_avx(auVar126,auVar174);
  uVar109 = auVar45._0_4_;
  auVar127._4_4_ = uVar109;
  auVar127._0_4_ = uVar109;
  auVar127._8_4_ = uVar109;
  auVar127._12_4_ = uVar109;
  auVar127._16_4_ = uVar109;
  auVar127._20_4_ = uVar109;
  auVar127._24_4_ = uVar109;
  auVar127._28_4_ = uVar109;
  auVar192._8_4_ = 1;
  auVar192._0_8_ = 0x100000001;
  auVar192._12_4_ = 1;
  auVar192._16_4_ = 1;
  auVar192._20_4_ = 1;
  auVar192._24_4_ = 1;
  auVar192._28_4_ = 1;
  auVar83 = ZEXT1632(auVar45);
  auVar71 = vpermps_avx2(auVar192,auVar83);
  auVar72 = vbroadcastss_avx512vl(auVar53);
  auVar84 = ZEXT1632(auVar53);
  auVar73 = vpermps_avx512vl(auVar192,auVar84);
  auVar75 = vbroadcastss_avx512vl(auVar54);
  auVar68 = ZEXT1632(auVar54);
  auVar76 = vpermps_avx512vl(auVar192,auVar68);
  auVar77 = vbroadcastss_avx512vl(auVar46);
  auVar80 = ZEXT1632(auVar46);
  auVar78 = vpermps_avx512vl(auVar192,auVar80);
  auVar193._4_4_ = fVar210;
  auVar193._0_4_ = fVar210;
  auVar193._8_4_ = fVar210;
  auVar193._12_4_ = fVar210;
  auVar193._16_4_ = fVar210;
  auVar193._20_4_ = fVar210;
  auVar193._24_4_ = fVar210;
  auVar193._28_4_ = fVar210;
  auVar81 = auVar244._0_32_;
  auVar69 = vpermps_avx512vl(auVar81,auVar83);
  auVar167._8_4_ = 3;
  auVar167._0_8_ = 0x300000003;
  auVar167._12_4_ = 3;
  auVar167._16_4_ = 3;
  auVar167._20_4_ = 3;
  auVar167._24_4_ = 3;
  auVar167._28_4_ = 3;
  auVar70 = vpermps_avx512vl(auVar167,auVar83);
  auVar79 = vpermps_avx512vl(auVar81,auVar84);
  auVar83 = vpermps_avx2(auVar167,auVar84);
  auVar67 = vpermps_avx512vl(auVar81,auVar68);
  auVar84 = vpermps_avx2(auVar167,auVar68);
  auVar68 = vpermps_avx512vl(auVar81,auVar80);
  auVar80 = vpermps_avx512vl(auVar167,auVar80);
  auVar47 = vfmadd132ps_fma(auVar74,auVar174,_DAT_01f7b040);
  auVar74 = vsubps_avx(auVar230,ZEXT1632(auVar47));
  auVar81 = vmulps_avx512vl(auVar72,ZEXT1632(auVar47));
  auVar85 = ZEXT1632(auVar47);
  auVar82 = vmulps_avx512vl(auVar73,auVar85);
  auVar46 = vfmadd231ps_fma(auVar81,auVar74,auVar127);
  auVar45 = vfmadd231ps_fma(auVar82,auVar74,auVar71);
  auVar81 = vmulps_avx512vl(auVar75,auVar85);
  auVar82 = vmulps_avx512vl(auVar76,auVar85);
  auVar72 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar72);
  auVar73 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar73);
  auVar81 = vmulps_avx512vl(auVar77,auVar85);
  auVar82 = ZEXT1632(auVar47);
  auVar78 = vmulps_avx512vl(auVar78,auVar82);
  auVar75 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar75);
  auVar76 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar76);
  fVar206 = auVar47._0_4_;
  fVar208 = auVar47._4_4_;
  auVar22._4_4_ = fVar208 * auVar72._4_4_;
  auVar22._0_4_ = fVar206 * auVar72._0_4_;
  fVar195 = auVar47._8_4_;
  auVar22._8_4_ = fVar195 * auVar72._8_4_;
  fVar205 = auVar47._12_4_;
  auVar22._12_4_ = fVar205 * auVar72._12_4_;
  auVar22._16_4_ = auVar72._16_4_ * 0.0;
  auVar22._20_4_ = auVar72._20_4_ * 0.0;
  auVar22._24_4_ = auVar72._24_4_ * 0.0;
  auVar22._28_4_ = fVar100;
  auVar23._4_4_ = fVar208 * auVar73._4_4_;
  auVar23._0_4_ = fVar206 * auVar73._0_4_;
  auVar23._8_4_ = fVar195 * auVar73._8_4_;
  auVar23._12_4_ = fVar205 * auVar73._12_4_;
  auVar23._16_4_ = auVar73._16_4_ * 0.0;
  auVar23._20_4_ = auVar73._20_4_ * 0.0;
  auVar23._24_4_ = auVar73._24_4_ * 0.0;
  auVar23._28_4_ = auVar71._28_4_;
  auVar46 = vfmadd231ps_fma(auVar22,auVar74,ZEXT1632(auVar46));
  auVar45 = vfmadd231ps_fma(auVar23,auVar74,ZEXT1632(auVar45));
  auVar119._0_4_ = fVar206 * auVar75._0_4_;
  auVar119._4_4_ = fVar208 * auVar75._4_4_;
  auVar119._8_4_ = fVar195 * auVar75._8_4_;
  auVar119._12_4_ = fVar205 * auVar75._12_4_;
  auVar119._16_4_ = auVar75._16_4_ * 0.0;
  auVar119._20_4_ = auVar75._20_4_ * 0.0;
  auVar119._24_4_ = auVar75._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar24._4_4_ = fVar208 * auVar76._4_4_;
  auVar24._0_4_ = fVar206 * auVar76._0_4_;
  auVar24._8_4_ = fVar195 * auVar76._8_4_;
  auVar24._12_4_ = fVar205 * auVar76._12_4_;
  auVar24._16_4_ = auVar76._16_4_ * 0.0;
  auVar24._20_4_ = auVar76._20_4_ * 0.0;
  auVar24._24_4_ = auVar76._24_4_ * 0.0;
  auVar24._28_4_ = auVar75._28_4_;
  auVar53 = vfmadd231ps_fma(auVar119,auVar74,auVar72);
  auVar54 = vfmadd231ps_fma(auVar24,auVar74,auVar73);
  auVar25._28_4_ = auVar73._28_4_;
  auVar25._0_28_ =
       ZEXT1628(CONCAT412(fVar205 * auVar54._12_4_,
                          CONCAT48(fVar195 * auVar54._8_4_,
                                   CONCAT44(fVar208 * auVar54._4_4_,fVar206 * auVar54._0_4_))));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar53._12_4_,
                                               CONCAT48(fVar195 * auVar53._8_4_,
                                                        CONCAT44(fVar208 * auVar53._4_4_,
                                                                 fVar206 * auVar53._0_4_)))),auVar74
                            ,ZEXT1632(auVar46));
  auVar66 = vfmadd231ps_fma(auVar25,auVar74,ZEXT1632(auVar45));
  auVar71 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar46));
  auVar72 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar45));
  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar71 = vmulps_avx512vl(auVar71,auVar73);
  auVar72 = vmulps_avx512vl(auVar72,auVar73);
  auVar187._0_4_ = fVar210 * auVar71._0_4_;
  auVar187._4_4_ = fVar210 * auVar71._4_4_;
  auVar187._8_4_ = fVar210 * auVar71._8_4_;
  auVar187._12_4_ = fVar210 * auVar71._12_4_;
  auVar187._16_4_ = fVar210 * auVar71._16_4_;
  auVar187._20_4_ = fVar210 * auVar71._20_4_;
  auVar187._24_4_ = fVar210 * auVar71._24_4_;
  auVar187._28_4_ = 0;
  auVar71 = vmulps_avx512vl(auVar193,auVar72);
  auVar45 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
  auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar120._0_4_ = auVar187._0_4_ + auVar63._0_4_;
  auVar120._4_4_ = auVar187._4_4_ + auVar63._4_4_;
  auVar120._8_4_ = auVar187._8_4_ + auVar63._8_4_;
  auVar120._12_4_ = auVar187._12_4_ + auVar63._12_4_;
  auVar120._16_4_ = auVar187._16_4_ + 0.0;
  auVar120._20_4_ = auVar187._20_4_ + 0.0;
  auVar120._24_4_ = auVar187._24_4_ + 0.0;
  auVar120._28_4_ = 0;
  auVar85 = ZEXT1632(auVar45);
  auVar76 = vpermt2ps_avx512vl(auVar187,_DAT_01fb9fc0,auVar85);
  auVar77 = vaddps_avx512vl(ZEXT1632(auVar66),auVar71);
  auVar78 = vpermt2ps_avx512vl(auVar71,_DAT_01fb9fc0,auVar85);
  auVar71 = vsubps_avx(auVar72,auVar76);
  auVar76 = vsubps_avx512vl(auVar75,auVar78);
  auVar78 = vmulps_avx512vl(auVar79,auVar82);
  auVar81 = vmulps_avx512vl(auVar83,auVar82);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar70);
  auVar70 = vmulps_avx512vl(auVar67,auVar82);
  auVar81 = vmulps_avx512vl(auVar84,auVar82);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar79);
  auVar83 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar83);
  auVar79 = vmulps_avx512vl(auVar68,auVar82);
  auVar68 = vmulps_avx512vl(auVar80,auVar82);
  auVar46 = vfmadd231ps_fma(auVar79,auVar74,auVar67);
  auVar79 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar84);
  auVar67 = vmulps_avx512vl(auVar82,auVar70);
  auVar80 = ZEXT1632(auVar47);
  auVar68 = vmulps_avx512vl(auVar80,auVar83);
  auVar78 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar78);
  auVar69 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar69);
  auVar79 = vmulps_avx512vl(auVar80,auVar79);
  auVar70 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar205 * auVar46._12_4_,
                                          CONCAT48(fVar195 * auVar46._8_4_,
                                                   CONCAT44(fVar208 * auVar46._4_4_,
                                                            fVar206 * auVar46._0_4_)))),auVar74,
                       auVar70);
  auVar83 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar83);
  auVar26._4_4_ = fVar208 * auVar70._4_4_;
  auVar26._0_4_ = fVar206 * auVar70._0_4_;
  auVar26._8_4_ = fVar195 * auVar70._8_4_;
  auVar26._12_4_ = fVar205 * auVar70._12_4_;
  auVar26._16_4_ = auVar70._16_4_ * 0.0;
  auVar26._20_4_ = auVar70._20_4_ * 0.0;
  auVar26._24_4_ = auVar70._24_4_ * 0.0;
  auVar26._28_4_ = auVar84._28_4_;
  auVar84 = vmulps_avx512vl(auVar80,auVar83);
  auVar79 = vfmadd231ps_avx512vl(auVar26,auVar74,auVar78);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar69,auVar74);
  auVar74 = vsubps_avx512vl(auVar70,auVar78);
  auVar83 = vsubps_avx512vl(auVar83,auVar69);
  auVar74 = vmulps_avx512vl(auVar74,auVar73);
  auVar83 = vmulps_avx512vl(auVar83,auVar73);
  fVar100 = fVar210 * auVar74._0_4_;
  fVar206 = fVar210 * auVar74._4_4_;
  auVar27._4_4_ = fVar206;
  auVar27._0_4_ = fVar100;
  fVar208 = fVar210 * auVar74._8_4_;
  auVar27._8_4_ = fVar208;
  fVar195 = fVar210 * auVar74._12_4_;
  auVar27._12_4_ = fVar195;
  fVar205 = fVar210 * auVar74._16_4_;
  auVar27._16_4_ = fVar205;
  fVar207 = fVar210 * auVar74._20_4_;
  auVar27._20_4_ = fVar207;
  fVar210 = fVar210 * auVar74._24_4_;
  auVar27._24_4_ = fVar210;
  auVar27._28_4_ = auVar74._28_4_;
  auVar83 = vmulps_avx512vl(auVar193,auVar83);
  auVar73 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar85);
  auVar78 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar85);
  auVar194._0_4_ = auVar79._0_4_ + fVar100;
  auVar194._4_4_ = auVar79._4_4_ + fVar206;
  auVar194._8_4_ = auVar79._8_4_ + fVar208;
  auVar194._12_4_ = auVar79._12_4_ + fVar195;
  auVar194._16_4_ = auVar79._16_4_ + fVar205;
  auVar194._20_4_ = auVar79._20_4_ + fVar207;
  auVar194._24_4_ = auVar79._24_4_ + fVar210;
  auVar194._28_4_ = auVar79._28_4_ + auVar74._28_4_;
  auVar74 = vpermt2ps_avx512vl(auVar27,_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar69 = vaddps_avx512vl(auVar84,auVar83);
  auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,ZEXT1632(auVar45));
  auVar74 = vsubps_avx(auVar73,auVar74);
  auVar83 = vsubps_avx512vl(auVar78,auVar83);
  auVar131 = ZEXT1632(auVar63);
  auVar70 = vsubps_avx512vl(auVar79,auVar131);
  auVar144 = ZEXT1632(auVar66);
  auVar67 = vsubps_avx512vl(auVar84,auVar144);
  auVar68 = vsubps_avx512vl(auVar73,auVar72);
  auVar70 = vaddps_avx512vl(auVar70,auVar68);
  auVar68 = vsubps_avx512vl(auVar78,auVar75);
  auVar67 = vaddps_avx512vl(auVar67,auVar68);
  auVar68 = vmulps_avx512vl(auVar144,auVar70);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar131,auVar67);
  auVar80 = vmulps_avx512vl(auVar77,auVar70);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar120,auVar67);
  auVar81 = vmulps_avx512vl(auVar76,auVar70);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar71,auVar67);
  auVar82 = vmulps_avx512vl(auVar75,auVar70);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar72,auVar67);
  auVar85 = vmulps_avx512vl(auVar84,auVar70);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar79,auVar67);
  auVar86 = vmulps_avx512vl(auVar69,auVar70);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar194,auVar67);
  auVar87 = vmulps_avx512vl(auVar83,auVar70);
  auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar74,auVar67);
  auVar70 = vmulps_avx512vl(auVar78,auVar70);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar73,auVar67);
  auVar67 = vminps_avx512vl(auVar68,auVar80);
  auVar68 = vmaxps_avx512vl(auVar68,auVar80);
  auVar80 = vminps_avx512vl(auVar81,auVar82);
  auVar67 = vminps_avx512vl(auVar67,auVar80);
  auVar80 = vmaxps_avx512vl(auVar81,auVar82);
  auVar68 = vmaxps_avx512vl(auVar68,auVar80);
  auVar80 = vminps_avx512vl(auVar85,auVar86);
  auVar81 = vmaxps_avx512vl(auVar85,auVar86);
  auVar82 = vminps_avx512vl(auVar87,auVar70);
  auVar80 = vminps_avx512vl(auVar80,auVar82);
  auVar67 = vminps_avx512vl(auVar67,auVar80);
  auVar70 = vmaxps_avx512vl(auVar87,auVar70);
  auVar70 = vmaxps_avx512vl(auVar81,auVar70);
  auVar70 = vmaxps_avx512vl(auVar68,auVar70);
  uVar16 = vcmpps_avx512vl(auVar67,local_260,2);
  uVar17 = vcmpps_avx512vl(auVar70,local_280,5);
  bVar28 = (byte)uVar16 & (byte)uVar17 & 0x7f;
  if (bVar28 != 0) {
    auVar70 = vsubps_avx512vl(auVar72,auVar131);
    auVar67 = vsubps_avx512vl(auVar75,auVar144);
    auVar68 = vsubps_avx512vl(auVar73,auVar79);
    auVar70 = vaddps_avx512vl(auVar70,auVar68);
    auVar68 = vsubps_avx512vl(auVar78,auVar84);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar144,auVar70);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar131);
    auVar77 = vmulps_avx512vl(auVar77,auVar70);
    auVar77 = vfnmadd213ps_avx512vl(auVar120,auVar67,auVar77);
    auVar76 = vmulps_avx512vl(auVar76,auVar70);
    auVar76 = vfnmadd213ps_avx512vl(auVar71,auVar67,auVar76);
    auVar71 = vmulps_avx512vl(auVar75,auVar70);
    auVar75 = vfnmadd231ps_avx512vl(auVar71,auVar67,auVar72);
    auVar71 = vmulps_avx512vl(auVar84,auVar70);
    auVar84 = vfnmadd231ps_avx512vl(auVar71,auVar67,auVar79);
    auVar71 = vmulps_avx512vl(auVar69,auVar70);
    auVar69 = vfnmadd213ps_avx512vl(auVar194,auVar67,auVar71);
    auVar71 = vmulps_avx512vl(auVar83,auVar70);
    auVar79 = vfnmadd213ps_avx512vl(auVar74,auVar67,auVar71);
    auVar74 = vmulps_avx512vl(auVar78,auVar70);
    auVar73 = vfnmadd231ps_avx512vl(auVar74,auVar73,auVar67);
    auVar71 = vminps_avx(auVar68,auVar77);
    auVar74 = vmaxps_avx(auVar68,auVar77);
    auVar72 = vminps_avx(auVar76,auVar75);
    auVar72 = vminps_avx(auVar71,auVar72);
    auVar71 = vmaxps_avx(auVar76,auVar75);
    auVar74 = vmaxps_avx(auVar74,auVar71);
    auVar83 = vminps_avx(auVar84,auVar69);
    auVar71 = vmaxps_avx(auVar84,auVar69);
    auVar84 = vminps_avx(auVar79,auVar73);
    auVar83 = vminps_avx(auVar83,auVar84);
    auVar83 = vminps_avx(auVar72,auVar83);
    auVar72 = vmaxps_avx(auVar79,auVar73);
    auVar71 = vmaxps_avx(auVar71,auVar72);
    auVar74 = vmaxps_avx(auVar74,auVar71);
    uVar16 = vcmpps_avx512vl(auVar74,local_280,5);
    uVar17 = vcmpps_avx512vl(auVar83,local_260,2);
    bVar28 = bVar28 & (byte)uVar16 & (byte)uVar17;
    if (bVar28 != 0) {
      auStack_460[uVar30] = (uint)bVar28;
      uVar16 = vmovlps_avx(auVar43);
      (&uStack_240)[uVar30] = uVar16;
      uVar35 = vmovlps_avx(auVar44);
      auStack_1a0[uVar30] = uVar35;
      uVar30 = (ulong)((int)uVar30 + 1);
    }
  }
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar43);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar240 = ZEXT3264(auVar74);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar241 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT1664(auVar43);
  auVar243 = ZEXT3264(_DAT_01fb9fe0);
LAB_019c8adc:
  do {
    do {
      do {
        if ((int)uVar30 == 0) {
          if (bVar38) goto LAB_019c9a26;
          uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar21._4_4_ = uVar109;
          auVar21._0_4_ = uVar109;
          auVar21._8_4_ = uVar109;
          auVar21._12_4_ = uVar109;
          auVar21._16_4_ = uVar109;
          auVar21._20_4_ = uVar109;
          auVar21._24_4_ = uVar109;
          auVar21._28_4_ = uVar109;
          uVar16 = vcmpps_avx512vl(local_1c0,auVar21,2);
          uVar36 = (ulong)((uint)uVar37 & (uint)uVar16);
          goto LAB_019c7e92;
        }
        uVar29 = (int)uVar30 - 1;
        uVar31 = (ulong)uVar29;
        uVar7 = auStack_460[uVar31];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = auStack_1a0[uVar31];
        uVar35 = 0;
        for (uVar34 = (ulong)uVar7; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          uVar35 = uVar35 + 1;
        }
        uVar33 = uVar7 - 1 & uVar7;
        bVar41 = uVar33 == 0;
        auStack_460[uVar31] = uVar33;
        if (bVar41) {
          uVar30 = (ulong)uVar29;
        }
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar35;
        auVar43 = vpunpcklqdq_avx(auVar101,ZEXT416((int)uVar35 + 1));
        auVar43 = vcvtqq2ps_avx512vl(auVar43);
        auVar43 = vmulps_avx512vl(auVar43,auVar241._0_16_);
        uVar109 = *(undefined4 *)((long)&uStack_240 + uVar31 * 8 + 4);
        auVar18._4_4_ = uVar109;
        auVar18._0_4_ = uVar109;
        auVar18._8_4_ = uVar109;
        auVar18._12_4_ = uVar109;
        auVar47 = vmulps_avx512vl(auVar43,auVar18);
        auVar46 = auVar242._0_16_;
        auVar43 = vsubps_avx512vl(auVar46,auVar43);
        uVar109 = *(undefined4 *)(&uStack_240 + uVar31);
        auVar19._4_4_ = uVar109;
        auVar19._0_4_ = uVar109;
        auVar19._8_4_ = uVar109;
        auVar19._12_4_ = uVar109;
        auVar43 = vfmadd231ps_avx512vl(auVar47,auVar43,auVar19);
        auVar47 = vmovshdup_avx(auVar43);
        fVar210 = auVar47._0_4_ - auVar43._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar210));
        if (uVar7 == 0 || bVar41) goto LAB_019c85e2;
        auVar47 = vshufps_avx(auVar44,auVar44,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar210));
        auVar54 = vsubps_avx512vl(auVar46,auVar47);
        fVar100 = auVar47._0_4_;
        auVar139._0_4_ = fVar100 * fVar105;
        fVar206 = auVar47._4_4_;
        auVar139._4_4_ = fVar206 * fVar106;
        fVar208 = auVar47._8_4_;
        auVar139._8_4_ = fVar208 * fVar105;
        fVar195 = auVar47._12_4_;
        auVar139._12_4_ = fVar195 * fVar106;
        auVar149._0_4_ = fVar100 * fVar107;
        auVar149._4_4_ = fVar206 * fVar108;
        auVar149._8_4_ = fVar208 * fVar107;
        auVar149._12_4_ = fVar195 * fVar108;
        auVar161._0_4_ = fVar100 * fVar121;
        auVar161._4_4_ = fVar206 * fVar134;
        auVar161._8_4_ = fVar208 * fVar121;
        auVar161._12_4_ = fVar195 * fVar134;
        auVar122._0_4_ = fVar100 * fVar135;
        auVar122._4_4_ = fVar206 * fVar136;
        auVar122._8_4_ = fVar208 * fVar135;
        auVar122._12_4_ = fVar195 * fVar136;
        auVar47 = vfmadd231ps_fma(auVar139,auVar54,auVar160);
        auVar45 = vfmadd231ps_fma(auVar149,auVar54,auVar51);
        auVar53 = vfmadd231ps_fma(auVar161,auVar54,auVar49);
        auVar54 = vfmadd231ps_fma(auVar122,auVar54,auVar178);
        auVar132._16_16_ = auVar47;
        auVar132._0_16_ = auVar47;
        auVar145._16_16_ = auVar45;
        auVar145._0_16_ = auVar45;
        auVar153._16_16_ = auVar53;
        auVar153._0_16_ = auVar53;
        auVar71 = vpermps_avx512vl(auVar243._0_32_,ZEXT1632(auVar43));
        auVar74 = vsubps_avx(auVar145,auVar132);
        auVar45 = vfmadd213ps_fma(auVar74,auVar71,auVar132);
        auVar74 = vsubps_avx(auVar153,auVar145);
        auVar63 = vfmadd213ps_fma(auVar74,auVar71,auVar145);
        auVar47 = vsubps_avx(auVar54,auVar53);
        auVar146._16_16_ = auVar47;
        auVar146._0_16_ = auVar47;
        auVar47 = vfmadd213ps_fma(auVar146,auVar71,auVar153);
        auVar74 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar45));
        auVar45 = vfmadd213ps_fma(auVar74,auVar71,ZEXT1632(auVar45));
        auVar74 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar63));
        auVar47 = vfmadd213ps_fma(auVar74,auVar71,ZEXT1632(auVar63));
        auVar74 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar45));
        auVar137 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar74,auVar71);
        auVar74 = vmulps_avx512vl(auVar74,auVar240._0_32_);
        auVar89._16_16_ = auVar74._16_16_;
        fVar100 = fVar210 * 0.33333334;
        auVar162._0_8_ =
             CONCAT44(auVar137._4_4_ + fVar100 * auVar74._4_4_,
                      auVar137._0_4_ + fVar100 * auVar74._0_4_);
        auVar162._8_4_ = auVar137._8_4_ + fVar100 * auVar74._8_4_;
        auVar162._12_4_ = auVar137._12_4_ + fVar100 * auVar74._12_4_;
        auVar140._0_4_ = fVar100 * auVar74._16_4_;
        auVar140._4_4_ = fVar100 * auVar74._20_4_;
        auVar140._8_4_ = fVar100 * auVar74._24_4_;
        auVar140._12_4_ = fVar100 * auVar74._28_4_;
        auVar61 = vsubps_avx((undefined1  [16])0x0,auVar140);
        auVar63 = vshufpd_avx(auVar137,auVar137,3);
        auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar47 = vsubps_avx(auVar63,auVar137);
        auVar45 = vsubps_avx(auVar66,(undefined1  [16])0x0);
        auVar179._0_4_ = auVar47._0_4_ + auVar45._0_4_;
        auVar179._4_4_ = auVar47._4_4_ + auVar45._4_4_;
        auVar179._8_4_ = auVar47._8_4_ + auVar45._8_4_;
        auVar179._12_4_ = auVar47._12_4_ + auVar45._12_4_;
        auVar47 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar45 = vshufps_avx(auVar162,auVar162,0xb1);
        auVar53 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar228._4_4_ = auVar179._0_4_;
        auVar228._0_4_ = auVar179._0_4_;
        auVar228._8_4_ = auVar179._0_4_;
        auVar228._12_4_ = auVar179._0_4_;
        auVar57 = vshufps_avx(auVar179,auVar179,0x55);
        fVar100 = auVar57._0_4_;
        auVar190._0_4_ = auVar47._0_4_ * fVar100;
        fVar206 = auVar57._4_4_;
        auVar190._4_4_ = auVar47._4_4_ * fVar206;
        fVar208 = auVar57._8_4_;
        auVar190._8_4_ = auVar47._8_4_ * fVar208;
        fVar195 = auVar57._12_4_;
        auVar190._12_4_ = auVar47._12_4_ * fVar195;
        auVar197._0_4_ = auVar45._0_4_ * fVar100;
        auVar197._4_4_ = auVar45._4_4_ * fVar206;
        auVar197._8_4_ = auVar45._8_4_ * fVar208;
        auVar197._12_4_ = auVar45._12_4_ * fVar195;
        auVar214._0_4_ = auVar53._0_4_ * fVar100;
        auVar214._4_4_ = auVar53._4_4_ * fVar206;
        auVar214._8_4_ = auVar53._8_4_ * fVar208;
        auVar214._12_4_ = auVar53._12_4_ * fVar195;
        auVar180._0_4_ = auVar54._0_4_ * fVar100;
        auVar180._4_4_ = auVar54._4_4_ * fVar206;
        auVar180._8_4_ = auVar54._8_4_ * fVar208;
        auVar180._12_4_ = auVar54._12_4_ * fVar195;
        auVar47 = vfmadd231ps_fma(auVar190,auVar228,auVar137);
        auVar45 = vfmadd231ps_fma(auVar197,auVar228,auVar162);
        auVar59 = vfmadd231ps_fma(auVar214,auVar228,auVar61);
        auVar60 = vfmadd231ps_fma(auVar180,(undefined1  [16])0x0,auVar228);
        auVar57 = vshufpd_avx(auVar47,auVar47,1);
        auVar58 = vshufpd_avx(auVar45,auVar45,1);
        auVar55 = vshufpd_avx512vl(auVar59,auVar59,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar53 = vminss_avx(auVar47,auVar45);
        auVar47 = vmaxss_avx(auVar45,auVar47);
        auVar54 = vminss_avx(auVar59,auVar60);
        auVar45 = vmaxss_avx(auVar60,auVar59);
        auVar53 = vminss_avx(auVar53,auVar54);
        auVar47 = vmaxss_avx(auVar45,auVar47);
        auVar54 = vminss_avx(auVar57,auVar58);
        auVar45 = vmaxss_avx(auVar58,auVar57);
        auVar57 = vminss_avx512f(auVar55,auVar56);
        auVar58 = vmaxss_avx512f(auVar56,auVar55);
        auVar45 = vmaxss_avx(auVar58,auVar45);
        auVar54 = vminss_avx512f(auVar54,auVar57);
        fVar206 = auVar45._0_4_;
        fVar100 = auVar47._0_4_;
        if (auVar53._0_4_ < 0.0001) {
          bVar42 = fVar206 == -0.0001;
          bVar39 = NAN(fVar206);
          if (fVar206 <= -0.0001) goto LAB_019c8d06;
          break;
        }
LAB_019c8d06:
        vucomiss_avx512f(auVar54);
        bVar42 = fVar206 <= -0.0001;
        bVar40 = -0.0001 < fVar100;
        bVar39 = bVar42;
        if (!bVar42) break;
        uVar16 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar17 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar28 = (byte)uVar16 & (byte)uVar17;
        bVar12 = (bVar28 & 1) == 0;
        bVar42 = bVar40 && bVar12;
        bVar39 = bVar40 && (bVar28 & 1) == 0;
      } while (!bVar40 || !bVar12);
      auVar59 = auVar245._0_16_;
      vcmpss_avx512f(auVar53,auVar59,1);
      uVar16 = vcmpss_avx512f(auVar47,auVar59,1);
      bVar40 = (bool)((byte)uVar16 & 1);
      auVar89._0_16_ = auVar246._0_16_;
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar246._0_4_);
      vucomiss_avx512f(auVar88._0_16_);
      bVar39 = (bool)(!bVar42 | bVar39);
      bVar40 = bVar39 == false;
      auVar91._16_16_ = auVar89._16_16_;
      auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (uint)bVar39 * auVar245._0_4_ + (uint)!bVar39 * 0x7f800000;
      auVar58 = auVar90._0_16_;
      auVar93._16_16_ = auVar89._16_16_;
      auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar39 * auVar245._0_4_ + (uint)!bVar39 * -0x800000;
      auVar57 = auVar92._0_16_;
      uVar16 = vcmpss_avx512f(auVar54,auVar59,1);
      bVar42 = (bool)((byte)uVar16 & 1);
      auVar95._16_16_ = auVar89._16_16_;
      auVar95._0_16_ = auVar246._0_16_;
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * auVar246._0_4_);
      vucomiss_avx512f(auVar94._0_16_);
      if ((bVar39) || (bVar40)) {
        auVar54 = vucomiss_avx512f(auVar53);
        if ((bVar39) || (bVar40)) {
          auVar60 = vxorps_avx512vl(auVar53,auVar239._0_16_);
          auVar53 = vsubss_avx512f(auVar54,auVar53);
          auVar53 = vdivss_avx512f(auVar60,auVar53);
          auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
          auVar54 = vfmadd213ss_avx512f(auVar54,auVar59,auVar53);
          auVar53 = auVar54;
        }
        else {
          auVar53 = vxorps_avx512vl(auVar54,auVar54);
          vucomiss_avx512f(auVar53);
          auVar54 = ZEXT416(0x3f800000);
          if ((bVar39) || (bVar40)) {
            auVar54 = SUB6416(ZEXT464(0xff800000),0);
            auVar53 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar58 = vminss_avx512f(auVar58,auVar53);
        auVar57 = vmaxss_avx(auVar54,auVar57);
      }
      auVar246 = ZEXT464(0x3f800000);
      uVar16 = vcmpss_avx512f(auVar45,auVar59,1);
      bVar42 = (bool)((byte)uVar16 & 1);
      auVar45 = auVar246._0_16_;
      fVar208 = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * 0x3f800000);
      if ((auVar88._0_4_ != fVar208) || (NAN(auVar88._0_4_) || NAN(fVar208))) {
        if ((fVar206 != fVar100) || (NAN(fVar206) || NAN(fVar100))) {
          auVar47 = vxorps_avx512vl(auVar47,auVar239._0_16_);
          auVar181._0_4_ = auVar47._0_4_ / (fVar206 - fVar100);
          auVar181._4_12_ = auVar47._4_12_;
          auVar47 = vsubss_avx512f(auVar45,auVar181);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar59,auVar181);
          auVar53 = auVar47;
        }
        else if ((fVar100 != 0.0) ||
                (auVar47 = auVar45, auVar53 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar100))) {
          auVar47 = SUB6416(ZEXT464(0xff800000),0);
          auVar53 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar58 = vminss_avx(auVar58,auVar53);
        auVar57 = vmaxss_avx(auVar47,auVar57);
      }
      bVar42 = auVar94._0_4_ != fVar208;
      auVar47 = vminss_avx512f(auVar58,auVar45);
      auVar97._16_16_ = auVar89._16_16_;
      auVar97._0_16_ = auVar58;
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (uint)bVar42 * auVar47._0_4_ + (uint)!bVar42 * auVar58._0_4_;
      auVar47 = vmaxss_avx512f(auVar45,auVar57);
      auVar99._16_16_ = auVar89._16_16_;
      auVar99._0_16_ = auVar57;
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (uint)bVar42 * auVar47._0_4_ + (uint)!bVar42 * auVar57._0_4_;
      auVar47 = vmaxss_avx512f(auVar59,auVar96._0_16_);
      auVar53 = vminss_avx512f(auVar98._0_16_,auVar45);
    } while (auVar53._0_4_ < auVar47._0_4_);
    auVar59 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
    auVar60 = vminss_avx512f(ZEXT416((uint)(auVar53._0_4_ + 0.1)),auVar45);
    auVar123._0_8_ = auVar137._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar198._8_8_ = auVar162._0_8_;
    auVar198._0_8_ = auVar162._0_8_;
    auVar215._8_8_ = auVar61._0_8_;
    auVar215._0_8_ = auVar61._0_8_;
    auVar47 = vshufpd_avx(auVar162,auVar162,3);
    auVar53 = vshufpd_avx(auVar61,auVar61,3);
    auVar54 = vshufps_avx(auVar59,auVar60,0);
    auVar58 = vsubps_avx512vl(auVar46,auVar54);
    fVar100 = auVar54._0_4_;
    auVar150._0_4_ = fVar100 * auVar63._0_4_;
    fVar206 = auVar54._4_4_;
    auVar150._4_4_ = fVar206 * auVar63._4_4_;
    fVar208 = auVar54._8_4_;
    auVar150._8_4_ = fVar208 * auVar63._8_4_;
    fVar195 = auVar54._12_4_;
    auVar150._12_4_ = fVar195 * auVar63._12_4_;
    auVar163._0_4_ = fVar100 * auVar47._0_4_;
    auVar163._4_4_ = fVar206 * auVar47._4_4_;
    auVar163._8_4_ = fVar208 * auVar47._8_4_;
    auVar163._12_4_ = fVar195 * auVar47._12_4_;
    auVar231._0_4_ = auVar53._0_4_ * fVar100;
    auVar231._4_4_ = auVar53._4_4_ * fVar206;
    auVar231._8_4_ = auVar53._8_4_ * fVar208;
    auVar231._12_4_ = auVar53._12_4_ * fVar195;
    auVar141._0_4_ = fVar100 * auVar66._0_4_;
    auVar141._4_4_ = fVar206 * auVar66._4_4_;
    auVar141._8_4_ = fVar208 * auVar66._8_4_;
    auVar141._12_4_ = fVar195 * auVar66._12_4_;
    auVar63 = vfmadd231ps_fma(auVar150,auVar58,auVar123);
    auVar66 = vfmadd231ps_fma(auVar163,auVar58,auVar198);
    auVar57 = vfmadd231ps_fma(auVar231,auVar58,auVar215);
    auVar58 = vfmadd231ps_fma(auVar141,auVar58,ZEXT816(0));
    auVar53 = vsubss_avx512f(auVar45,auVar59);
    auVar47 = vmovshdup_avx(auVar44);
    auVar137 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar59._0_4_)),auVar44,auVar53);
    auVar53 = vsubss_avx512f(auVar45,auVar60);
    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar60._0_4_)),auVar44,auVar53);
    auVar61 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar210));
    auVar47 = vsubps_avx(auVar66,auVar63);
    auVar147 = auVar237._0_16_;
    auVar53 = vmulps_avx512vl(auVar47,auVar147);
    auVar47 = vsubps_avx(auVar57,auVar66);
    auVar54 = vmulps_avx512vl(auVar47,auVar147);
    auVar47 = vsubps_avx(auVar58,auVar57);
    auVar47 = vmulps_avx512vl(auVar47,auVar147);
    auVar44 = vminps_avx(auVar54,auVar47);
    auVar47 = vmaxps_avx(auVar54,auVar47);
    auVar44 = vminps_avx(auVar53,auVar44);
    auVar47 = vmaxps_avx(auVar53,auVar47);
    auVar53 = vshufpd_avx(auVar44,auVar44,3);
    auVar54 = vshufpd_avx(auVar47,auVar47,3);
    auVar44 = vminps_avx(auVar44,auVar53);
    auVar47 = vmaxps_avx(auVar47,auVar54);
    fVar210 = auVar61._0_4_;
    auVar182._0_4_ = auVar44._0_4_ * fVar210;
    auVar182._4_4_ = auVar44._4_4_ * fVar210;
    auVar182._8_4_ = auVar44._8_4_ * fVar210;
    auVar182._12_4_ = auVar44._12_4_ * fVar210;
    auVar170._0_4_ = fVar210 * auVar47._0_4_;
    auVar170._4_4_ = fVar210 * auVar47._4_4_;
    auVar170._8_4_ = fVar210 * auVar47._8_4_;
    auVar170._12_4_ = fVar210 * auVar47._12_4_;
    auVar61 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar55._0_4_ - auVar137._0_4_)));
    auVar47 = vshufpd_avx(auVar63,auVar63,3);
    auVar44 = vshufpd_avx(auVar66,auVar66,3);
    auVar53 = vshufpd_avx(auVar57,auVar57,3);
    auVar54 = vshufpd_avx(auVar58,auVar58,3);
    auVar47 = vsubps_avx(auVar47,auVar63);
    auVar63 = vsubps_avx(auVar44,auVar66);
    auVar66 = vsubps_avx(auVar53,auVar57);
    auVar54 = vsubps_avx(auVar54,auVar58);
    auVar44 = vminps_avx(auVar47,auVar63);
    auVar47 = vmaxps_avx(auVar47,auVar63);
    auVar53 = vminps_avx(auVar66,auVar54);
    auVar53 = vminps_avx(auVar44,auVar53);
    auVar44 = vmaxps_avx(auVar66,auVar54);
    auVar47 = vmaxps_avx(auVar47,auVar44);
    fVar210 = auVar61._0_4_;
    auVar216._0_4_ = fVar210 * auVar53._0_4_;
    auVar216._4_4_ = fVar210 * auVar53._4_4_;
    auVar216._8_4_ = fVar210 * auVar53._8_4_;
    auVar216._12_4_ = fVar210 * auVar53._12_4_;
    auVar199._0_4_ = fVar210 * auVar47._0_4_;
    auVar199._4_4_ = fVar210 * auVar47._4_4_;
    auVar199._8_4_ = fVar210 * auVar47._8_4_;
    auVar199._12_4_ = fVar210 * auVar47._12_4_;
    auVar54 = vinsertps_avx(auVar43,auVar137,0x10);
    auVar56 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9f90,auVar55);
    auVar112._0_4_ = auVar54._0_4_ + auVar56._0_4_;
    auVar112._4_4_ = auVar54._4_4_ + auVar56._4_4_;
    auVar112._8_4_ = auVar54._8_4_ + auVar56._8_4_;
    auVar112._12_4_ = auVar54._12_4_ + auVar56._12_4_;
    auVar20._8_4_ = 0x3f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar20._12_4_ = 0x3f000000;
    auVar61 = vmulps_avx512vl(auVar112,auVar20);
    auVar44 = vshufps_avx(auVar61,auVar61,0x54);
    uVar109 = auVar61._0_4_;
    auVar115._4_4_ = uVar109;
    auVar115._0_4_ = uVar109;
    auVar115._8_4_ = uVar109;
    auVar115._12_4_ = uVar109;
    auVar53 = vfmadd213ps_fma(auVar52,auVar115,auVar50);
    auVar63 = vfmadd213ps_fma(local_290,auVar115,auVar4);
    auVar66 = vfmadd213ps_fma(local_2a0,auVar115,auVar48);
    auVar47 = vsubps_avx(auVar63,auVar53);
    auVar53 = vfmadd213ps_fma(auVar47,auVar115,auVar53);
    auVar47 = vsubps_avx(auVar66,auVar63);
    auVar47 = vfmadd213ps_fma(auVar47,auVar115,auVar63);
    auVar47 = vsubps_avx(auVar47,auVar53);
    auVar53 = vfmadd231ps_fma(auVar53,auVar47,auVar115);
    auVar57 = vmulps_avx512vl(auVar47,auVar147);
    auVar224._8_8_ = auVar53._0_8_;
    auVar224._0_8_ = auVar53._0_8_;
    auVar47 = vshufpd_avx(auVar53,auVar53,3);
    auVar53 = vshufps_avx(auVar61,auVar61,0x55);
    auVar63 = vsubps_avx(auVar47,auVar224);
    auVar66 = vfmadd231ps_fma(auVar224,auVar53,auVar63);
    auVar232._8_8_ = auVar57._0_8_;
    auVar232._0_8_ = auVar57._0_8_;
    auVar47 = vshufpd_avx(auVar57,auVar57,3);
    auVar47 = vsubps_avx512vl(auVar47,auVar232);
    auVar47 = vfmadd213ps_avx512vl(auVar47,auVar53,auVar232);
    auVar116._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
    auVar116._8_4_ = auVar63._8_4_ ^ 0x80000000;
    auVar116._12_4_ = auVar63._12_4_ ^ 0x80000000;
    auVar53 = vmovshdup_avx512vl(auVar47);
    auVar233._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
    auVar233._8_4_ = auVar53._8_4_ ^ 0x80000000;
    auVar233._12_4_ = auVar53._12_4_ ^ 0x80000000;
    auVar57 = vmovshdup_avx512vl(auVar63);
    auVar58 = vpermt2ps_avx512vl(auVar233,ZEXT416(5),auVar63);
    auVar62 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar245 = ZEXT1664(auVar62);
    auVar53 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar63._0_4_)),auVar47,auVar57);
    auVar63 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar116);
    auVar142._0_4_ = auVar53._0_4_;
    auVar142._4_4_ = auVar142._0_4_;
    auVar142._8_4_ = auVar142._0_4_;
    auVar142._12_4_ = auVar142._0_4_;
    auVar47 = vdivps_avx(auVar58,auVar142);
    auVar64 = vdivps_avx512vl(auVar63,auVar142);
    fVar210 = auVar66._0_4_;
    auVar53 = vshufps_avx(auVar66,auVar66,0x55);
    auVar225._0_4_ = fVar210 * auVar47._0_4_ + auVar53._0_4_ * auVar64._0_4_;
    auVar225._4_4_ = fVar210 * auVar47._4_4_ + auVar53._4_4_ * auVar64._4_4_;
    auVar225._8_4_ = fVar210 * auVar47._8_4_ + auVar53._8_4_ * auVar64._8_4_;
    auVar225._12_4_ = fVar210 * auVar47._12_4_ + auVar53._12_4_ * auVar64._12_4_;
    auVar59 = vsubps_avx(auVar44,auVar225);
    auVar53 = vmovshdup_avx(auVar47);
    auVar44 = vinsertps_avx(auVar182,auVar216,0x1c);
    auVar234._0_4_ = auVar53._0_4_ * auVar44._0_4_;
    auVar234._4_4_ = auVar53._4_4_ * auVar44._4_4_;
    auVar234._8_4_ = auVar53._8_4_ * auVar44._8_4_;
    auVar234._12_4_ = auVar53._12_4_ * auVar44._12_4_;
    auVar60 = vinsertps_avx512f(auVar170,auVar199,0x1c);
    auVar53 = vmulps_avx512vl(auVar53,auVar60);
    auVar58 = vminps_avx512vl(auVar234,auVar53);
    auVar66 = vmaxps_avx(auVar53,auVar234);
    auVar57 = vmovshdup_avx(auVar64);
    auVar53 = vinsertps_avx(auVar216,auVar182,0x4c);
    auVar217._0_4_ = auVar57._0_4_ * auVar53._0_4_;
    auVar217._4_4_ = auVar57._4_4_ * auVar53._4_4_;
    auVar217._8_4_ = auVar57._8_4_ * auVar53._8_4_;
    auVar217._12_4_ = auVar57._12_4_ * auVar53._12_4_;
    auVar63 = vinsertps_avx(auVar199,auVar170,0x4c);
    auVar200._0_4_ = auVar57._0_4_ * auVar63._0_4_;
    auVar200._4_4_ = auVar57._4_4_ * auVar63._4_4_;
    auVar200._8_4_ = auVar57._8_4_ * auVar63._8_4_;
    auVar200._12_4_ = auVar57._12_4_ * auVar63._12_4_;
    auVar57 = vminps_avx(auVar217,auVar200);
    auVar58 = vaddps_avx512vl(auVar58,auVar57);
    auVar57 = vmaxps_avx(auVar200,auVar217);
    auVar201._0_4_ = auVar66._0_4_ + auVar57._0_4_;
    auVar201._4_4_ = auVar66._4_4_ + auVar57._4_4_;
    auVar201._8_4_ = auVar66._8_4_ + auVar57._8_4_;
    auVar201._12_4_ = auVar66._12_4_ + auVar57._12_4_;
    auVar218._8_8_ = 0x3f80000000000000;
    auVar218._0_8_ = 0x3f80000000000000;
    auVar66 = vsubps_avx(auVar218,auVar201);
    auVar57 = vsubps_avx(auVar218,auVar58);
    auVar58 = vsubps_avx(auVar54,auVar61);
    auVar61 = vsubps_avx(auVar56,auVar61);
    fVar195 = auVar58._0_4_;
    auVar235._0_4_ = fVar195 * auVar66._0_4_;
    fVar205 = auVar58._4_4_;
    auVar235._4_4_ = fVar205 * auVar66._4_4_;
    fVar207 = auVar58._8_4_;
    auVar235._8_4_ = fVar207 * auVar66._8_4_;
    fVar209 = auVar58._12_4_;
    auVar235._12_4_ = fVar209 * auVar66._12_4_;
    auVar65 = vbroadcastss_avx512vl(auVar47);
    auVar44 = vmulps_avx512vl(auVar65,auVar44);
    auVar60 = vmulps_avx512vl(auVar65,auVar60);
    auVar65 = vminps_avx512vl(auVar44,auVar60);
    auVar60 = vmaxps_avx512vl(auVar60,auVar44);
    auVar44 = vbroadcastss_avx512vl(auVar64);
    auVar53 = vmulps_avx512vl(auVar44,auVar53);
    auVar44 = vmulps_avx512vl(auVar44,auVar63);
    auVar63 = vminps_avx512vl(auVar53,auVar44);
    auVar63 = vaddps_avx512vl(auVar65,auVar63);
    auVar58 = vmulps_avx512vl(auVar58,auVar57);
    fVar210 = auVar61._0_4_;
    auVar202._0_4_ = fVar210 * auVar66._0_4_;
    fVar100 = auVar61._4_4_;
    auVar202._4_4_ = fVar100 * auVar66._4_4_;
    fVar206 = auVar61._8_4_;
    auVar202._8_4_ = fVar206 * auVar66._8_4_;
    fVar208 = auVar61._12_4_;
    auVar202._12_4_ = fVar208 * auVar66._12_4_;
    auVar219._0_4_ = fVar210 * auVar57._0_4_;
    auVar219._4_4_ = fVar100 * auVar57._4_4_;
    auVar219._8_4_ = fVar206 * auVar57._8_4_;
    auVar219._12_4_ = fVar208 * auVar57._12_4_;
    auVar44 = vmaxps_avx(auVar44,auVar53);
    auVar171._0_4_ = auVar60._0_4_ + auVar44._0_4_;
    auVar171._4_4_ = auVar60._4_4_ + auVar44._4_4_;
    auVar171._8_4_ = auVar60._8_4_ + auVar44._8_4_;
    auVar171._12_4_ = auVar60._12_4_ + auVar44._12_4_;
    auVar183._8_8_ = 0x3f800000;
    auVar183._0_8_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar183,auVar171);
    auVar53 = vsubps_avx512vl(auVar183,auVar63);
    auVar229._0_4_ = fVar195 * auVar44._0_4_;
    auVar229._4_4_ = fVar205 * auVar44._4_4_;
    auVar229._8_4_ = fVar207 * auVar44._8_4_;
    auVar229._12_4_ = fVar209 * auVar44._12_4_;
    auVar226._0_4_ = fVar195 * auVar53._0_4_;
    auVar226._4_4_ = fVar205 * auVar53._4_4_;
    auVar226._8_4_ = fVar207 * auVar53._8_4_;
    auVar226._12_4_ = fVar209 * auVar53._12_4_;
    auVar172._0_4_ = fVar210 * auVar44._0_4_;
    auVar172._4_4_ = fVar100 * auVar44._4_4_;
    auVar172._8_4_ = fVar206 * auVar44._8_4_;
    auVar172._12_4_ = fVar208 * auVar44._12_4_;
    auVar184._0_4_ = fVar210 * auVar53._0_4_;
    auVar184._4_4_ = fVar100 * auVar53._4_4_;
    auVar184._8_4_ = fVar206 * auVar53._8_4_;
    auVar184._12_4_ = fVar208 * auVar53._12_4_;
    auVar44 = vminps_avx(auVar229,auVar226);
    auVar53 = vminps_avx512vl(auVar172,auVar184);
    auVar63 = vminps_avx512vl(auVar44,auVar53);
    auVar44 = vmaxps_avx(auVar226,auVar229);
    auVar53 = vmaxps_avx(auVar184,auVar172);
    auVar53 = vmaxps_avx(auVar53,auVar44);
    auVar66 = vminps_avx512vl(auVar235,auVar58);
    auVar44 = vminps_avx(auVar202,auVar219);
    auVar44 = vminps_avx(auVar66,auVar44);
    auVar44 = vhaddps_avx(auVar63,auVar44);
    auVar66 = vmaxps_avx512vl(auVar58,auVar235);
    auVar63 = vmaxps_avx(auVar219,auVar202);
    auVar63 = vmaxps_avx(auVar63,auVar66);
    auVar53 = vhaddps_avx(auVar53,auVar63);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
    auVar173._0_4_ = auVar44._0_4_ + auVar59._0_4_;
    auVar173._4_4_ = auVar44._4_4_ + auVar59._4_4_;
    auVar173._8_4_ = auVar44._8_4_ + auVar59._8_4_;
    auVar173._12_4_ = auVar44._12_4_ + auVar59._12_4_;
    auVar185._0_4_ = auVar53._0_4_ + auVar59._0_4_;
    auVar185._4_4_ = auVar53._4_4_ + auVar59._4_4_;
    auVar185._8_4_ = auVar53._8_4_ + auVar59._8_4_;
    auVar185._12_4_ = auVar53._12_4_ + auVar59._12_4_;
    auVar44 = vmaxps_avx(auVar54,auVar173);
    auVar53 = vminps_avx(auVar185,auVar56);
    uVar35 = vcmpps_avx512vl(auVar53,auVar44,1);
  } while ((uVar35 & 3) != 0);
  uVar35 = vcmpps_avx512vl(auVar185,auVar56,1);
  uVar16 = vcmpps_avx512vl(auVar43,auVar173,1);
  if (((ushort)uVar16 & (ushort)uVar35 & 1) == 0) {
    bVar28 = 0;
  }
  else {
    auVar44 = vmovshdup_avx(auVar173);
    bVar28 = auVar137._0_4_ < auVar44._0_4_ & (byte)(uVar35 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar30 || uVar7 != 0 && !bVar41) | bVar28) != 1) goto LAB_019c99aa;
  lVar32 = 0xc9;
  do {
    lVar32 = lVar32 + -1;
    if (lVar32 == 0) goto LAB_019c8adc;
    auVar43 = vsubss_avx512f(auVar45,auVar59);
    fVar206 = auVar43._0_4_;
    fVar210 = fVar206 * fVar206 * fVar206;
    fVar208 = auVar59._0_4_;
    fVar100 = fVar208 * 3.0 * fVar206 * fVar206;
    fVar206 = fVar206 * fVar208 * fVar208 * 3.0;
    auVar129._4_4_ = fVar210;
    auVar129._0_4_ = fVar210;
    auVar129._8_4_ = fVar210;
    auVar129._12_4_ = fVar210;
    auVar124._4_4_ = fVar100;
    auVar124._0_4_ = fVar100;
    auVar124._8_4_ = fVar100;
    auVar124._12_4_ = fVar100;
    auVar102._4_4_ = fVar206;
    auVar102._0_4_ = fVar206;
    auVar102._8_4_ = fVar206;
    auVar102._12_4_ = fVar206;
    fVar208 = fVar208 * fVar208 * fVar208;
    auVar151._0_4_ = (float)local_2b0._0_4_ * fVar208;
    auVar151._4_4_ = (float)local_2b0._4_4_ * fVar208;
    auVar151._8_4_ = fStack_2a8 * fVar208;
    auVar151._12_4_ = fStack_2a4 * fVar208;
    auVar43 = vfmadd231ps_fma(auVar151,auVar48,auVar102);
    auVar43 = vfmadd231ps_fma(auVar43,auVar4,auVar124);
    auVar43 = vfmadd231ps_fma(auVar43,auVar50,auVar129);
    auVar103._8_8_ = auVar43._0_8_;
    auVar103._0_8_ = auVar43._0_8_;
    auVar43 = vshufpd_avx(auVar43,auVar43,3);
    auVar44 = vshufps_avx(auVar59,auVar59,0x55);
    auVar43 = vsubps_avx(auVar43,auVar103);
    auVar44 = vfmadd213ps_fma(auVar43,auVar44,auVar103);
    fVar210 = auVar44._0_4_;
    auVar43 = vshufps_avx(auVar44,auVar44,0x55);
    auVar104._0_4_ = auVar47._0_4_ * fVar210 + auVar64._0_4_ * auVar43._0_4_;
    auVar104._4_4_ = auVar47._4_4_ * fVar210 + auVar64._4_4_ * auVar43._4_4_;
    auVar104._8_4_ = auVar47._8_4_ * fVar210 + auVar64._8_4_ * auVar43._8_4_;
    auVar104._12_4_ = auVar47._12_4_ * fVar210 + auVar64._12_4_ * auVar43._12_4_;
    auVar59 = vsubps_avx(auVar59,auVar104);
    auVar43 = vandps_avx512vl(auVar44,auVar238._0_16_);
    auVar44 = vprolq_avx512vl(auVar43,0x20);
    auVar43 = vmaxss_avx(auVar44,auVar43);
    bVar41 = (float)local_2c0._0_4_ < auVar43._0_4_;
  } while ((float)local_2c0._0_4_ <= auVar43._0_4_);
  auVar43 = vucomiss_avx512f(auVar62);
  if (bVar41) goto LAB_019c8adc;
  auVar47 = vucomiss_avx512f(auVar43);
  auVar246 = ZEXT1664(auVar47);
  if (bVar41) goto LAB_019c8adc;
  vmovshdup_avx(auVar43);
  auVar47 = vucomiss_avx512f(auVar62);
  if (bVar41) goto LAB_019c8adc;
  auVar44 = vucomiss_avx512f(auVar47);
  auVar246 = ZEXT1664(auVar44);
  if (bVar41) goto LAB_019c8adc;
  auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar61 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar45 = vdpps_avx(auVar61,local_2d0,0x7f);
  auVar53 = vdpps_avx(auVar61,local_2e0,0x7f);
  auVar54 = vdpps_avx(auVar61,local_2f0,0x7f);
  auVar63 = vdpps_avx(auVar61,local_300,0x7f);
  auVar66 = vdpps_avx(auVar61,local_310,0x7f);
  auVar57 = vdpps_avx(auVar61,local_320,0x7f);
  auVar58 = vdpps_avx(auVar61,local_330,0x7f);
  auVar61 = vdpps_avx(auVar61,local_340,0x7f);
  auVar59 = vsubss_avx512f(auVar44,auVar47);
  fVar210 = auVar47._0_4_;
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar66._0_4_)),auVar59,auVar45);
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar210)),auVar59,auVar53);
  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar210)),auVar59,auVar54);
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar61._0_4_)),auVar59,auVar63);
  auVar44 = vsubss_avx512f(auVar44,auVar43);
  auVar152._0_4_ = auVar44._0_4_;
  fVar210 = auVar152._0_4_ * auVar152._0_4_ * auVar152._0_4_;
  local_120 = auVar43._0_4_;
  fVar100 = local_120 * 3.0 * auVar152._0_4_ * auVar152._0_4_;
  fVar206 = auVar152._0_4_ * local_120 * local_120 * 3.0;
  fVar208 = local_120 * local_120 * local_120;
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar54._0_4_)),ZEXT416((uint)fVar206),auVar53)
  ;
  auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar100),auVar45);
  vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar210),auVar47);
  auVar47 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar41) goto LAB_019c8adc;
  fVar195 = *(float *)(ray + k * 4 + 0x100);
  if (fVar195 < auVar47._0_4_) goto LAB_019c8adc;
  auVar44 = vshufps_avx(auVar43,auVar43,0x55);
  auVar53 = vsubps_avx512vl(auVar46,auVar44);
  fVar205 = auVar44._0_4_;
  auVar186._0_4_ = fVar205 * (float)local_360._0_4_;
  fVar207 = auVar44._4_4_;
  auVar186._4_4_ = fVar207 * (float)local_360._4_4_;
  fVar209 = auVar44._8_4_;
  auVar186._8_4_ = fVar209 * fStack_358;
  fVar211 = auVar44._12_4_;
  auVar186._12_4_ = fVar211 * fStack_354;
  auVar191._0_4_ = fVar205 * (float)local_3b0._0_4_;
  auVar191._4_4_ = fVar207 * (float)local_3b0._4_4_;
  auVar191._8_4_ = fVar209 * fStack_3a8;
  auVar191._12_4_ = fVar211 * fStack_3a4;
  auVar203._0_4_ = fVar205 * (float)local_3c0._0_4_;
  auVar203._4_4_ = fVar207 * (float)local_3c0._4_4_;
  auVar203._8_4_ = fVar209 * fStack_3b8;
  auVar203._12_4_ = fVar211 * fStack_3b4;
  auVar164._0_4_ = fVar205 * (float)local_380._0_4_;
  auVar164._4_4_ = fVar207 * (float)local_380._4_4_;
  auVar164._8_4_ = fVar209 * fStack_378;
  auVar164._12_4_ = fVar211 * fStack_374;
  auVar44 = vfmadd231ps_fma(auVar186,auVar53,local_350);
  auVar46 = vfmadd231ps_fma(auVar191,auVar53,local_390);
  auVar45 = vfmadd231ps_fma(auVar203,auVar53,local_3a0);
  auVar53 = vfmadd231ps_fma(auVar164,auVar53,local_370);
  auVar44 = vsubps_avx(auVar46,auVar44);
  auVar46 = vsubps_avx(auVar45,auVar46);
  auVar45 = vsubps_avx(auVar53,auVar45);
  auVar204._0_4_ = local_120 * auVar46._0_4_;
  auVar204._4_4_ = local_120 * auVar46._4_4_;
  auVar204._8_4_ = local_120 * auVar46._8_4_;
  auVar204._12_4_ = local_120 * auVar46._12_4_;
  auVar152._4_4_ = auVar152._0_4_;
  auVar152._8_4_ = auVar152._0_4_;
  auVar152._12_4_ = auVar152._0_4_;
  auVar44 = vfmadd231ps_fma(auVar204,auVar152,auVar44);
  auVar165._0_4_ = local_120 * auVar45._0_4_;
  auVar165._4_4_ = local_120 * auVar45._4_4_;
  auVar165._8_4_ = local_120 * auVar45._8_4_;
  auVar165._12_4_ = local_120 * auVar45._12_4_;
  auVar46 = vfmadd231ps_fma(auVar165,auVar152,auVar46);
  auVar166._0_4_ = local_120 * auVar46._0_4_;
  auVar166._4_4_ = local_120 * auVar46._4_4_;
  auVar166._8_4_ = local_120 * auVar46._8_4_;
  auVar166._12_4_ = local_120 * auVar46._12_4_;
  auVar44 = vfmadd231ps_fma(auVar166,auVar152,auVar44);
  auVar44 = vmulps_avx512vl(auVar44,auVar147);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar28 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019c9997;
    auVar143._0_4_ = fVar208 * (float)local_400._0_4_;
    auVar143._4_4_ = fVar208 * (float)local_400._4_4_;
    auVar143._8_4_ = fVar208 * fStack_3f8;
    auVar143._12_4_ = fVar208 * fStack_3f4;
    auVar130._4_4_ = fVar206;
    auVar130._0_4_ = fVar206;
    auVar130._8_4_ = fVar206;
    auVar130._12_4_ = fVar206;
    auVar46 = vfmadd132ps_fma(auVar130,auVar143,local_3f0);
    auVar125._4_4_ = fVar100;
    auVar125._0_4_ = fVar100;
    auVar125._8_4_ = fVar100;
    auVar125._12_4_ = fVar100;
    auVar46 = vfmadd132ps_fma(auVar125,auVar46,local_3e0);
    auVar117._4_4_ = fVar210;
    auVar117._0_4_ = fVar210;
    auVar117._8_4_ = fVar210;
    auVar117._12_4_ = fVar210;
    auVar53 = vfmadd132ps_fma(auVar117,auVar46,local_3d0);
    auVar46 = vshufps_avx(auVar53,auVar53,0xc9);
    auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
    auVar118._0_4_ = auVar53._0_4_ * auVar45._0_4_;
    auVar118._4_4_ = auVar53._4_4_ * auVar45._4_4_;
    auVar118._8_4_ = auVar53._8_4_ * auVar45._8_4_;
    auVar118._12_4_ = auVar53._12_4_ * auVar45._12_4_;
    auVar44 = vfmsub231ps_fma(auVar118,auVar44,auVar46);
    auVar133._8_4_ = 1;
    auVar133._0_8_ = 0x100000001;
    auVar133._12_4_ = 1;
    auVar133._16_4_ = 1;
    auVar133._20_4_ = 1;
    auVar133._24_4_ = 1;
    auVar133._28_4_ = 1;
    local_100 = vpermps_avx2(auVar133,ZEXT1632(auVar43));
    auVar74 = vpermps_avx2(auVar133,ZEXT1632(auVar44));
    local_160 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar44));
    local_140 = auVar44._0_4_;
    local_180[0] = (RTCHitN)auVar74[0];
    local_180[1] = (RTCHitN)auVar74[1];
    local_180[2] = (RTCHitN)auVar74[2];
    local_180[3] = (RTCHitN)auVar74[3];
    local_180[4] = (RTCHitN)auVar74[4];
    local_180[5] = (RTCHitN)auVar74[5];
    local_180[6] = (RTCHitN)auVar74[6];
    local_180[7] = (RTCHitN)auVar74[7];
    local_180[8] = (RTCHitN)auVar74[8];
    local_180[9] = (RTCHitN)auVar74[9];
    local_180[10] = (RTCHitN)auVar74[10];
    local_180[0xb] = (RTCHitN)auVar74[0xb];
    local_180[0xc] = (RTCHitN)auVar74[0xc];
    local_180[0xd] = (RTCHitN)auVar74[0xd];
    local_180[0xe] = (RTCHitN)auVar74[0xe];
    local_180[0xf] = (RTCHitN)auVar74[0xf];
    local_180[0x10] = (RTCHitN)auVar74[0x10];
    local_180[0x11] = (RTCHitN)auVar74[0x11];
    local_180[0x12] = (RTCHitN)auVar74[0x12];
    local_180[0x13] = (RTCHitN)auVar74[0x13];
    local_180[0x14] = (RTCHitN)auVar74[0x14];
    local_180[0x15] = (RTCHitN)auVar74[0x15];
    local_180[0x16] = (RTCHitN)auVar74[0x16];
    local_180[0x17] = (RTCHitN)auVar74[0x17];
    local_180[0x18] = (RTCHitN)auVar74[0x18];
    local_180[0x19] = (RTCHitN)auVar74[0x19];
    local_180[0x1a] = (RTCHitN)auVar74[0x1a];
    local_180[0x1b] = (RTCHitN)auVar74[0x1b];
    local_180[0x1c] = (RTCHitN)auVar74[0x1c];
    local_180[0x1d] = (RTCHitN)auVar74[0x1d];
    local_180[0x1e] = (RTCHitN)auVar74[0x1e];
    local_180[0x1f] = (RTCHitN)auVar74[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1e0._0_8_;
    uStack_d8 = local_1e0._8_8_;
    uStack_d0 = local_1e0._16_8_;
    uStack_c8 = local_1e0._24_8_;
    local_c0 = local_200;
    vpcmpeqd_avx2(local_200,local_200);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = auVar47._0_4_;
    local_420 = local_220;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar8->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_450);
      auVar243 = ZEXT3264(_DAT_01fb9fe0);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar242 = ZEXT1664(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar241 = ZEXT1664(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar239 = ZEXT1664(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar238 = ZEXT1664(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar237 = ZEXT1664(auVar43);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar244 = ZEXT3264(auVar74);
    }
    if (local_420 == (undefined1  [32])0x0) {
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar240 = ZEXT3264(auVar74);
      auVar43 = vxorps_avx512vl(auVar62,auVar62);
      auVar245 = ZEXT1664(auVar43);
    }
    else {
      p_Var9 = context->args->filter;
      if (p_Var9 == (RTCFilterFunctionN)0x0) {
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar240 = ZEXT3264(auVar74);
        auVar43 = vxorps_avx512vl(auVar62,auVar62);
        auVar245 = ZEXT1664(auVar43);
      }
      else {
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar240 = ZEXT3264(auVar74);
        auVar43 = vxorps_avx512vl(auVar62,auVar62);
        auVar245 = ZEXT1664(auVar43);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var9)(&local_450);
          auVar43 = vxorps_avx512vl(auVar43,auVar43);
          auVar245 = ZEXT1664(auVar43);
          auVar243 = ZEXT3264(_DAT_01fb9fe0);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar242 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar241 = ZEXT1664(auVar43);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar240 = ZEXT3264(auVar74);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar239 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar238 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar237 = ZEXT1664(auVar43);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar244 = ZEXT3264(auVar74);
        }
      }
      auVar246 = ZEXT464(0x3f800000);
      uVar35 = vptestmd_avx512vl(local_420,local_420);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar41 = (bool)((byte)uVar35 & 1);
      bVar42 = (bool)((byte)(uVar35 >> 1) & 1);
      bVar39 = (bool)((byte)(uVar35 >> 2) & 1);
      bVar40 = (bool)((byte)(uVar35 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar35 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar35 >> 6) & 1);
      bVar15 = SUB81(uVar35 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar41 * auVar74._0_4_ | (uint)!bVar41 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar42 * auVar74._4_4_ | (uint)!bVar42 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar39 * auVar74._8_4_ | (uint)!bVar39 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar40 * auVar74._12_4_ | (uint)!bVar40 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar12 * auVar74._16_4_ | (uint)!bVar12 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar13 * auVar74._20_4_ | (uint)!bVar13 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar14 * auVar74._24_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar15 * auVar74._28_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x11c);
      bVar28 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_019c9997;
    }
    auVar246 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x100) = fVar195;
  }
  bVar28 = 0;
LAB_019c9997:
  bVar38 = (bool)(bVar38 | bVar28);
  goto LAB_019c8adc;
LAB_019c99aa:
  auVar44 = vinsertps_avx(auVar137,auVar55,0x10);
  goto LAB_019c85e2;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }